

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [28];
  float *pfVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  Primitive PVar13;
  int iVar14;
  Geometry *pGVar15;
  __int_type_conflict _Var16;
  RTCFilterFunctionN p_Var17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar24;
  long lVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [28];
  byte bVar75;
  uint uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  Geometry *geometry;
  long lVar81;
  undefined4 uVar82;
  undefined8 uVar83;
  float fVar99;
  vint4 bi_2;
  undefined1 auVar89 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar98;
  float fVar100;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar88 [16];
  undefined1 auVar97 [32];
  undefined8 uVar104;
  vint4 bi_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar127 [32];
  float fVar118;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar119;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  vint4 ai_2;
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  vint4 ai;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  vint4 ai_1;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar175;
  float fVar182;
  float fVar183;
  undefined1 auVar176 [16];
  float fVar184;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar181 [64];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined4 uVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar195;
  float fVar199;
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar200;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  float fVar214;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar215;
  float fVar216;
  float fVar217;
  undefined1 auVar213 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7b5;
  int local_7b4;
  RayQueryContext *local_7b0;
  Ray *local_7a8;
  undefined1 local_7a0 [56];
  Precalculations *local_768;
  undefined1 local_760 [16];
  undefined1 auStack_750 [16];
  ulong local_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined4 local_5b8;
  float local_5b4;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  uint local_5a4;
  uint local_5a0;
  ulong local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined1 auStack_510 [8];
  float fStack_508;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [8];
  undefined8 uStack_418;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 auStack_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  int local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 local_200 [32];
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar120 [16];
  
  PVar13 = prim[1];
  uVar80 = (ulong)(byte)PVar13;
  fVar119 = *(float *)(prim + uVar80 * 0x19 + 0x12);
  auVar23 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar80 * 0x19 + 6));
  auVar146._0_4_ = fVar119 * (ray->dir).field_0.m128[0];
  auVar146._4_4_ = fVar119 * (ray->dir).field_0.m128[1];
  auVar146._8_4_ = fVar119 * (ray->dir).field_0.m128[2];
  auVar146._12_4_ = fVar119 * (ray->dir).field_0.m128[3];
  auVar84._0_4_ = fVar119 * auVar23._0_4_;
  auVar84._4_4_ = fVar119 * auVar23._4_4_;
  auVar84._8_4_ = fVar119 * auVar23._8_4_;
  auVar84._12_4_ = fVar119 * auVar23._12_4_;
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 4 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 5 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 6 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0xb + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar13 * 0xc + uVar80 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  uVar77 = (ulong)(uint)((int)(uVar80 * 9) * 2);
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + uVar80 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  uVar77 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar209._4_4_ = auVar146._0_4_;
  auVar209._0_4_ = auVar146._0_4_;
  auVar209._8_4_ = auVar146._0_4_;
  auVar209._12_4_ = auVar146._0_4_;
  auVar106 = vshufps_avx(auVar146,auVar146,0x55);
  auVar85 = vshufps_avx(auVar146,auVar146,0xaa);
  fVar119 = auVar85._0_4_;
  auVar193._0_4_ = fVar119 * auVar89._0_4_;
  fVar118 = auVar85._4_4_;
  auVar193._4_4_ = fVar118 * auVar89._4_4_;
  fVar98 = auVar85._8_4_;
  auVar193._8_4_ = fVar98 * auVar89._8_4_;
  fVar99 = auVar85._12_4_;
  auVar193._12_4_ = fVar99 * auVar89._12_4_;
  auVar188._0_4_ = auVar22._0_4_ * fVar119;
  auVar188._4_4_ = auVar22._4_4_ * fVar118;
  auVar188._8_4_ = auVar22._8_4_ * fVar98;
  auVar188._12_4_ = auVar22._12_4_ * fVar99;
  auVar170._0_4_ = auVar120._0_4_ * fVar119;
  auVar170._4_4_ = auVar120._4_4_ * fVar118;
  auVar170._8_4_ = auVar120._8_4_ * fVar98;
  auVar170._12_4_ = auVar120._12_4_ * fVar99;
  auVar85 = vfmadd231ps_fma(auVar193,auVar106,auVar19);
  auVar107 = vfmadd231ps_fma(auVar188,auVar106,auVar21);
  auVar106 = vfmadd231ps_fma(auVar170,auVar86,auVar106);
  auVar131 = vfmadd231ps_fma(auVar85,auVar209,auVar23);
  auVar107 = vfmadd231ps_fma(auVar107,auVar209,auVar20);
  auVar137 = vfmadd231ps_fma(auVar106,auVar87,auVar209);
  auVar210._4_4_ = auVar84._0_4_;
  auVar210._0_4_ = auVar84._0_4_;
  auVar210._8_4_ = auVar84._0_4_;
  auVar210._12_4_ = auVar84._0_4_;
  auVar106 = vshufps_avx(auVar84,auVar84,0x55);
  auVar85 = vshufps_avx(auVar84,auVar84,0xaa);
  fVar119 = auVar85._0_4_;
  auVar147._0_4_ = fVar119 * auVar89._0_4_;
  fVar118 = auVar85._4_4_;
  auVar147._4_4_ = fVar118 * auVar89._4_4_;
  fVar98 = auVar85._8_4_;
  auVar147._8_4_ = fVar98 * auVar89._8_4_;
  fVar99 = auVar85._12_4_;
  auVar147._12_4_ = fVar99 * auVar89._12_4_;
  auVar105._0_4_ = auVar22._0_4_ * fVar119;
  auVar105._4_4_ = auVar22._4_4_ * fVar118;
  auVar105._8_4_ = auVar22._8_4_ * fVar98;
  auVar105._12_4_ = auVar22._12_4_ * fVar99;
  auVar85._0_4_ = auVar120._0_4_ * fVar119;
  auVar85._4_4_ = auVar120._4_4_ * fVar118;
  auVar85._8_4_ = auVar120._8_4_ * fVar98;
  auVar85._12_4_ = auVar120._12_4_ * fVar99;
  auVar19 = vfmadd231ps_fma(auVar147,auVar106,auVar19);
  auVar89 = vfmadd231ps_fma(auVar105,auVar106,auVar21);
  auVar21 = vfmadd231ps_fma(auVar85,auVar106,auVar86);
  auVar22 = vfmadd231ps_fma(auVar19,auVar210,auVar23);
  auVar86 = vfmadd231ps_fma(auVar89,auVar210,auVar20);
  auVar120 = vfmadd231ps_fma(auVar21,auVar210,auVar87);
  local_2d0._8_4_ = 0x7fffffff;
  local_2d0._0_8_ = 0x7fffffff7fffffff;
  local_2d0._12_4_ = 0x7fffffff;
  auVar23 = vandps_avx(auVar131,local_2d0);
  auVar136._8_4_ = 0x219392ef;
  auVar136._0_8_ = 0x219392ef219392ef;
  auVar136._12_4_ = 0x219392ef;
  auVar23 = vcmpps_avx(auVar23,auVar136,1);
  auVar19 = vblendvps_avx(auVar131,auVar136,auVar23);
  auVar23 = vandps_avx(auVar107,local_2d0);
  auVar23 = vcmpps_avx(auVar23,auVar136,1);
  auVar89 = vblendvps_avx(auVar107,auVar136,auVar23);
  auVar23 = vandps_avx(auVar137,local_2d0);
  auVar23 = vcmpps_avx(auVar23,auVar136,1);
  auVar23 = vblendvps_avx(auVar137,auVar136,auVar23);
  auVar20 = vrcpps_avx(auVar19);
  auVar164._8_4_ = 0x3f800000;
  auVar164._0_8_ = &DAT_3f8000003f800000;
  auVar164._12_4_ = 0x3f800000;
  auVar19 = vfnmadd213ps_fma(auVar19,auVar20,auVar164);
  auVar20 = vfmadd132ps_fma(auVar19,auVar20,auVar20);
  auVar19 = vrcpps_avx(auVar89);
  auVar89 = vfnmadd213ps_fma(auVar89,auVar19,auVar164);
  auVar21 = vfmadd132ps_fma(auVar89,auVar19,auVar19);
  auVar19 = vrcpps_avx(auVar23);
  auVar89 = vfnmadd213ps_fma(auVar23,auVar19,auVar164);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar80 * 7 + 6);
  auVar23 = vpmovsxwd_avx(auVar23);
  auVar87 = vfmadd132ps_fma(auVar89,auVar19,auVar19);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar22);
  auVar137._0_4_ = auVar20._0_4_ * auVar23._0_4_;
  auVar137._4_4_ = auVar20._4_4_ * auVar23._4_4_;
  auVar137._8_4_ = auVar20._8_4_ * auVar23._8_4_;
  auVar137._12_4_ = auVar20._12_4_ * auVar23._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar80 * 9 + 6);
  auVar23 = vpmovsxwd_avx(auVar19);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar22);
  auVar148._0_4_ = auVar20._0_4_ * auVar23._0_4_;
  auVar148._4_4_ = auVar20._4_4_ * auVar23._4_4_;
  auVar148._8_4_ = auVar20._8_4_ * auVar23._8_4_;
  auVar148._12_4_ = auVar20._12_4_ * auVar23._12_4_;
  auVar107._1_3_ = 0;
  auVar107[0] = PVar13;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + 6);
  auVar19 = vpmovsxwd_avx(auVar89);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar80 * -2 + 6);
  auVar23 = vpmovsxwd_avx(auVar20);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar86);
  auVar171._0_4_ = auVar23._0_4_ * auVar21._0_4_;
  auVar171._4_4_ = auVar23._4_4_ * auVar21._4_4_;
  auVar171._8_4_ = auVar23._8_4_ * auVar21._8_4_;
  auVar171._12_4_ = auVar23._12_4_ * auVar21._12_4_;
  auVar23 = vcvtdq2ps_avx(auVar19);
  auVar23 = vsubps_avx(auVar23,auVar86);
  auVar106._0_4_ = auVar21._0_4_ * auVar23._0_4_;
  auVar106._4_4_ = auVar21._4_4_ * auVar23._4_4_;
  auVar106._8_4_ = auVar21._8_4_ * auVar23._8_4_;
  auVar106._12_4_ = auVar21._12_4_ * auVar23._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar77 + uVar80 + 6);
  auVar23 = vpmovsxwd_avx(auVar21);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar120);
  auVar131._0_4_ = auVar87._0_4_ * auVar23._0_4_;
  auVar131._4_4_ = auVar87._4_4_ * auVar23._4_4_;
  auVar131._8_4_ = auVar87._8_4_ * auVar23._8_4_;
  auVar131._12_4_ = auVar87._12_4_ * auVar23._12_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar80 * 0x17 + 6);
  auVar23 = vpmovsxwd_avx(auVar22);
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar23 = vsubps_avx(auVar23,auVar120);
  auVar86._0_4_ = auVar87._0_4_ * auVar23._0_4_;
  auVar86._4_4_ = auVar87._4_4_ * auVar23._4_4_;
  auVar86._8_4_ = auVar87._8_4_ * auVar23._8_4_;
  auVar86._12_4_ = auVar87._12_4_ * auVar23._12_4_;
  auVar23 = vpminsd_avx(auVar137,auVar148);
  auVar19 = vpminsd_avx(auVar171,auVar106);
  auVar23 = vmaxps_avx(auVar23,auVar19);
  auVar19 = vpminsd_avx(auVar131,auVar86);
  uVar82 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar176._4_4_ = uVar82;
  auVar176._0_4_ = uVar82;
  auVar176._8_4_ = uVar82;
  auVar176._12_4_ = uVar82;
  auVar19 = vmaxps_avx(auVar19,auVar176);
  auVar23 = vmaxps_avx(auVar23,auVar19);
  local_2e0._0_4_ = auVar23._0_4_ * 0.99999964;
  local_2e0._4_4_ = auVar23._4_4_ * 0.99999964;
  local_2e0._8_4_ = auVar23._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar23._12_4_ * 0.99999964;
  auVar23 = vpmaxsd_avx(auVar137,auVar148);
  auVar19 = vpmaxsd_avx(auVar171,auVar106);
  auVar23 = vminps_avx(auVar23,auVar19);
  auVar19 = vpmaxsd_avx(auVar131,auVar86);
  fVar119 = ray->tfar;
  auVar120._4_4_ = fVar119;
  auVar120._0_4_ = fVar119;
  auVar120._8_4_ = fVar119;
  auVar120._12_4_ = fVar119;
  auVar130 = ZEXT1664(auVar120);
  auVar19 = vminps_avx(auVar19,auVar120);
  auVar23 = vminps_avx(auVar23,auVar19);
  auVar87._0_4_ = auVar23._0_4_ * 1.0000004;
  auVar87._4_4_ = auVar23._4_4_ * 1.0000004;
  auVar87._8_4_ = auVar23._8_4_ * 1.0000004;
  auVar87._12_4_ = auVar23._12_4_ * 1.0000004;
  auVar107[4] = PVar13;
  auVar107._5_3_ = 0;
  auVar107[8] = PVar13;
  auVar107._9_3_ = 0;
  auVar107[0xc] = PVar13;
  auVar107._13_3_ = 0;
  auVar19 = vpcmpgtd_avx(auVar107,_DAT_01ff0cf0);
  auVar23 = vcmpps_avx(local_2e0,auVar87,2);
  auVar23 = vandps_avx(auVar23,auVar19);
  uVar76 = vmovmskps_avx(auVar23);
  local_7b5 = uVar76 != 0;
  if (local_7b5) {
    uVar76 = uVar76 & 0xff;
    local_460 = mm_lookupmask_ps._16_8_;
    uStack_458 = mm_lookupmask_ps._24_8_;
    uStack_450 = mm_lookupmask_ps._16_8_;
    uStack_448 = mm_lookupmask_ps._24_8_;
    do {
      auVar158 = local_3c0;
      auVar125 = auVar130._0_32_;
      lVar24 = 0;
      uVar80 = (ulong)uVar76;
      for (uVar77 = uVar80; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      local_728 = (ulong)*(uint *)(prim + 2);
      pGVar15 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      _Var16 = pGVar15[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_588 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
      uVar77 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                               _Var16 * *(uint *)(prim + lVar24 * 4 + 6));
      p_Var17 = pGVar15[1].intersectionFilterN;
      lVar24 = *(long *)&pGVar15[1].time_range.upper;
      pauVar1 = (undefined1 (*) [16])(lVar24 + (long)p_Var17 * uVar77);
      local_6c0 = *(undefined8 *)*pauVar1;
      uStack_6b8 = *(undefined8 *)(*pauVar1 + 8);
      pauVar2 = (undefined1 (*) [16])(lVar24 + (uVar77 + 1) * (long)p_Var17);
      local_490 = *(undefined8 *)*pauVar2;
      uStack_488 = *(undefined8 *)(*pauVar2 + 8);
      uVar79 = (uVar77 + 2) * (long)p_Var17;
      pauVar3 = (undefined1 (*) [16])(lVar24 + uVar79);
      local_4a0 = *(undefined8 *)*pauVar3;
      uStack_498 = *(undefined8 *)(*pauVar3 + 8);
      uVar80 = uVar80 - 1 & uVar80;
      pauVar4 = (undefined1 (*) [16])(lVar24 + (uVar77 + 3) * (long)p_Var17);
      local_4b0 = *(undefined8 *)*pauVar4;
      uStack_4a8 = *(undefined8 *)(*pauVar4 + 8);
      if (uVar80 != 0) {
        uVar78 = uVar80 - 1 & uVar80;
        lVar24 = 0;
        for (uVar77 = uVar80; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
          lVar24 = lVar24 + 1;
        }
        uVar79 = (ulong)*(uint *)(*(long *)&pGVar15->field_0x58 +
                                 *(uint *)(prim + lVar24 * 4 + 6) * _Var16) * (long)p_Var17;
        if (uVar78 != 0) {
          for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar14 = (int)pGVar15[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->org).field_0;
      auVar19 = vsubps_avx(*pauVar1,(undefined1  [16])aVar8);
      uVar82 = auVar19._0_4_;
      auVar138._4_4_ = uVar82;
      auVar138._0_4_ = uVar82;
      auVar138._8_4_ = uVar82;
      auVar138._12_4_ = uVar82;
      auVar23 = vshufps_avx(auVar19,auVar19,0x55);
      auVar19 = vshufps_avx(auVar19,auVar19,0xaa);
      aVar9 = (pre->ray_space).vx.field_0;
      aVar10 = (pre->ray_space).vy.field_0;
      fVar119 = (pre->ray_space).vz.field_0.m128[0];
      fVar118 = (pre->ray_space).vz.field_0.m128[1];
      fVar98 = (pre->ray_space).vz.field_0.m128[2];
      fVar99 = (pre->ray_space).vz.field_0.m128[3];
      auVar154._0_4_ = auVar19._0_4_ * fVar119;
      auVar154._4_4_ = auVar19._4_4_ * fVar118;
      auVar154._8_4_ = auVar19._8_4_ * fVar98;
      auVar154._12_4_ = auVar19._12_4_ * fVar99;
      auVar23 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar10,auVar23);
      auVar22 = vfmadd231ps_fma(auVar23,(undefined1  [16])aVar9,auVar138);
      auVar23 = vblendps_avx(auVar22,*pauVar1,8);
      auVar89 = vsubps_avx(*pauVar2,(undefined1  [16])aVar8);
      uVar82 = auVar89._0_4_;
      auVar155._4_4_ = uVar82;
      auVar155._0_4_ = uVar82;
      auVar155._8_4_ = uVar82;
      auVar155._12_4_ = uVar82;
      auVar19 = vshufps_avx(auVar89,auVar89,0x55);
      auVar89 = vshufps_avx(auVar89,auVar89,0xaa);
      auVar189._0_4_ = auVar89._0_4_ * fVar119;
      auVar189._4_4_ = auVar89._4_4_ * fVar118;
      auVar189._8_4_ = auVar89._8_4_ * fVar98;
      auVar189._12_4_ = auVar89._12_4_ * fVar99;
      auVar19 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar10,auVar19);
      auVar87 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar9,auVar155);
      auVar19 = vblendps_avx(auVar87,*pauVar2,8);
      auVar20 = vsubps_avx(*pauVar3,(undefined1  [16])aVar8);
      uVar82 = auVar20._0_4_;
      auVar165._4_4_ = uVar82;
      auVar165._0_4_ = uVar82;
      auVar165._8_4_ = uVar82;
      auVar165._12_4_ = uVar82;
      auVar89 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar194._0_4_ = auVar20._0_4_ * fVar119;
      auVar194._4_4_ = auVar20._4_4_ * fVar118;
      auVar194._8_4_ = auVar20._8_4_ * fVar98;
      auVar194._12_4_ = auVar20._12_4_ * fVar99;
      auVar89 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar10,auVar89);
      auVar86 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar9,auVar165);
      auVar89 = vblendps_avx(auVar86,*pauVar3,8);
      auVar21 = vsubps_avx(*pauVar4,(undefined1  [16])aVar8);
      uVar82 = auVar21._0_4_;
      auVar166._4_4_ = uVar82;
      auVar166._0_4_ = uVar82;
      auVar166._8_4_ = uVar82;
      auVar166._12_4_ = uVar82;
      auVar20 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar196._0_4_ = auVar21._0_4_ * fVar119;
      auVar196._4_4_ = auVar21._4_4_ * fVar118;
      auVar196._8_4_ = auVar21._8_4_ * fVar98;
      auVar196._12_4_ = auVar21._12_4_ * fVar99;
      auVar20 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar10,auVar20);
      auVar120 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar9,auVar166);
      auVar20 = vblendps_avx(auVar120,*pauVar4,8);
      auVar23 = vandps_avx(auVar23,local_2d0);
      auVar19 = vandps_avx(auVar19,local_2d0);
      auVar21 = vmaxps_avx(auVar23,auVar19);
      auVar23 = vandps_avx(auVar89,local_2d0);
      auVar19 = vandps_avx(auVar20,local_2d0);
      auVar23 = vmaxps_avx(auVar23,auVar19);
      auVar23 = vmaxps_avx(auVar21,auVar23);
      auVar19 = vmovshdup_avx(auVar23);
      auVar19 = vmaxss_avx(auVar19,auVar23);
      auVar23 = vshufpd_avx(auVar23,auVar23,1);
      auVar23 = vmaxss_avx(auVar23,auVar19);
      lVar24 = (long)iVar14 * 0x44;
      auVar19 = vmovshdup_avx(auVar22);
      uVar83 = auVar19._0_8_;
      local_3a0._8_8_ = uVar83;
      local_3a0._0_8_ = uVar83;
      local_3a0._16_8_ = uVar83;
      local_3a0._24_8_ = uVar83;
      auVar11 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x484);
      auVar19 = vmovshdup_avx(auVar87);
      uVar83 = auVar19._0_8_;
      local_620._8_8_ = uVar83;
      local_620._0_8_ = uVar83;
      local_620._16_8_ = uVar83;
      local_620._24_8_ = uVar83;
      auVar153 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x908);
      uVar192 = auVar86._0_4_;
      local_600._4_4_ = uVar192;
      local_600._0_4_ = uVar192;
      local_600._8_4_ = uVar192;
      local_600._12_4_ = uVar192;
      local_600._16_4_ = uVar192;
      local_600._20_4_ = uVar192;
      local_600._24_4_ = uVar192;
      local_600._28_4_ = uVar192;
      auVar19 = vmovshdup_avx(auVar86);
      uVar83 = auVar19._0_8_;
      local_5e0._8_8_ = uVar83;
      local_5e0._0_8_ = uVar83;
      local_5e0._16_8_ = uVar83;
      local_5e0._24_8_ = uVar83;
      pauVar5 = (undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0xd8c);
      fVar118 = *(float *)*pauVar5;
      fVar98 = *(float *)(catmullrom_basis0 + lVar24 + 0xd90);
      fVar99 = *(float *)(catmullrom_basis0 + lVar24 + 0xd94);
      fVar100 = *(float *)(catmullrom_basis0 + lVar24 + 0xd98);
      fVar101 = *(float *)(catmullrom_basis0 + lVar24 + 0xd9c);
      fVar102 = *(float *)(catmullrom_basis0 + lVar24 + 0xda0);
      fVar103 = *(float *)(catmullrom_basis0 + lVar24 + 0xda4);
      auVar74 = *(undefined1 (*) [28])*pauVar5;
      local_540 = auVar120._0_4_;
      auVar19 = vmovshdup_avx(auVar120);
      uVar83 = auVar19._0_8_;
      auVar113._0_4_ = fVar118 * local_540;
      auVar113._4_4_ = fVar98 * local_540;
      auVar113._8_4_ = fVar99 * local_540;
      auVar113._12_4_ = fVar100 * local_540;
      auVar113._16_4_ = fVar101 * local_540;
      auVar113._20_4_ = fVar102 * local_540;
      auVar113._24_4_ = fVar103 * local_540;
      auVar113._28_4_ = 0;
      local_4e0 = auVar19._0_4_;
      auVar90._0_4_ = local_4e0 * fVar118;
      fStack_4dc = auVar19._4_4_;
      auVar90._4_4_ = fStack_4dc * fVar98;
      auVar90._8_4_ = local_4e0 * fVar99;
      auVar90._12_4_ = fStack_4dc * fVar100;
      auVar90._16_4_ = local_4e0 * fVar101;
      auVar90._20_4_ = fStack_4dc * fVar102;
      auVar90._24_4_ = local_4e0 * fVar103;
      auVar90._28_4_ = 0;
      auVar19 = vfmadd231ps_fma(auVar113,auVar153,local_600);
      auVar89 = vfmadd231ps_fma(auVar90,auVar153,local_5e0);
      uVar82 = auVar87._0_4_;
      local_560._4_4_ = uVar82;
      local_560._0_4_ = uVar82;
      local_560._8_4_ = uVar82;
      local_560._12_4_ = uVar82;
      local_560._16_4_ = uVar82;
      local_560._20_4_ = uVar82;
      local_560._24_4_ = uVar82;
      local_560._28_4_ = uVar82;
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar11,local_560);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar11,local_620);
      auVar90 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24);
      uVar82 = auVar22._0_4_;
      local_720._4_4_ = uVar82;
      local_720._0_4_ = uVar82;
      local_720._8_4_ = uVar82;
      local_720._12_4_ = uVar82;
      local_720._16_4_ = uVar82;
      local_720._20_4_ = uVar82;
      local_720._24_4_ = uVar82;
      local_720._28_4_ = uVar82;
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar90,local_720);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar90,local_3a0);
      auVar113 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x908);
      auVar180 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0xd8c);
      auVar201 = ZEXT3264(auVar180);
      fStack_53c = local_540;
      fStack_538 = local_540;
      fStack_534 = local_540;
      fStack_530 = local_540;
      fStack_52c = local_540;
      fStack_528 = local_540;
      fStack_524 = local_540;
      fVar200 = auVar180._0_4_;
      fVar203 = auVar180._4_4_;
      auVar12._4_4_ = fVar203 * local_540;
      auVar12._0_4_ = fVar200 * local_540;
      fVar204 = auVar180._8_4_;
      auVar12._8_4_ = fVar204 * local_540;
      fVar205 = auVar180._12_4_;
      auVar12._12_4_ = fVar205 * local_540;
      fVar206 = auVar180._16_4_;
      auVar12._16_4_ = fVar206 * local_540;
      fVar207 = auVar180._20_4_;
      auVar12._20_4_ = fVar207 * local_540;
      fVar208 = auVar180._24_4_;
      auVar12._24_4_ = fVar208 * local_540;
      auVar12._28_4_ = local_540;
      auVar20 = vfmadd231ps_fma(auVar12,auVar113,local_600);
      auVar180._4_4_ = fStack_4dc * fVar203;
      auVar180._0_4_ = local_4e0 * fVar200;
      auVar180._8_4_ = local_4e0 * fVar204;
      auVar180._12_4_ = fStack_4dc * fVar205;
      auVar180._16_4_ = local_4e0 * fVar206;
      auVar180._20_4_ = fStack_4dc * fVar207;
      auVar180._24_4_ = local_4e0 * fVar208;
      auVar180._28_4_ = uVar192;
      auVar21 = vfmadd231ps_fma(auVar180,auVar113,local_5e0);
      auVar180 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x484);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar180,local_560);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar180,local_620);
      auVar12 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar12,local_720);
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar12,local_3a0);
      auVar108 = ZEXT1632(auVar20);
      auVar156 = ZEXT1632(auVar19);
      _local_420 = vsubps_avx(auVar108,auVar156);
      auVar126 = ZEXT1632(auVar21);
      auVar91 = ZEXT1632(auVar89);
      auVar97 = vsubps_avx(auVar126,auVar91);
      auVar92._0_4_ = auVar89._0_4_ * local_420._0_4_;
      auVar92._4_4_ = auVar89._4_4_ * local_420._4_4_;
      auVar92._8_4_ = auVar89._8_4_ * local_420._8_4_;
      auVar92._12_4_ = auVar89._12_4_ * local_420._12_4_;
      auVar92._16_4_ = local_420._16_4_ * 0.0;
      auVar92._20_4_ = local_420._20_4_ * 0.0;
      auVar92._24_4_ = local_420._24_4_ * 0.0;
      auVar92._28_4_ = 0;
      fVar195 = auVar97._0_4_;
      auVar109._0_4_ = fVar195 * auVar19._0_4_;
      fVar199 = auVar97._4_4_;
      auVar109._4_4_ = fVar199 * auVar19._4_4_;
      fVar214 = auVar97._8_4_;
      auVar109._8_4_ = fVar214 * auVar19._8_4_;
      fVar215 = auVar97._12_4_;
      auVar109._12_4_ = fVar215 * auVar19._12_4_;
      fVar216 = auVar97._16_4_;
      auVar109._16_4_ = fVar216 * 0.0;
      fVar217 = auVar97._20_4_;
      auVar109._20_4_ = fVar217 * 0.0;
      fVar175 = auVar97._24_4_;
      auVar109._24_4_ = fVar175 * 0.0;
      auVar109._28_4_ = 0;
      auVar92 = vsubps_avx(auVar92,auVar109);
      auVar19 = vpermilps_avx(*pauVar1,0xff);
      uVar104 = auVar19._0_8_;
      local_80._8_8_ = uVar104;
      local_80._0_8_ = uVar104;
      local_80._16_8_ = uVar104;
      local_80._24_8_ = uVar104;
      auVar89 = vpermilps_avx(*pauVar2,0xff);
      uVar104 = auVar89._0_8_;
      local_a0._8_8_ = uVar104;
      local_a0._0_8_ = uVar104;
      local_a0._16_8_ = uVar104;
      local_a0._24_8_ = uVar104;
      auVar89 = vpermilps_avx(*pauVar3,0xff);
      uVar104 = auVar89._0_8_;
      local_c0._8_8_ = uVar104;
      local_c0._0_8_ = uVar104;
      local_c0._16_8_ = uVar104;
      local_c0._24_8_ = uVar104;
      auVar89 = vpermilps_avx(*pauVar4,0xff);
      local_e0 = auVar89._0_8_;
      _local_300 = *pauVar5;
      auVar109 = _local_300;
      fVar119 = auVar89._0_4_;
      auVar157._0_4_ = fVar118 * fVar119;
      fVar118 = auVar89._4_4_;
      auVar157._4_4_ = fVar98 * fVar118;
      auVar157._8_4_ = fVar99 * fVar119;
      auVar157._12_4_ = fVar100 * fVar118;
      auVar157._16_4_ = fVar101 * fVar119;
      auVar157._20_4_ = fVar102 * fVar118;
      auVar157._24_4_ = fVar103 * fVar119;
      auVar157._28_4_ = 0;
      auVar89 = vfmadd231ps_fma(auVar157,local_c0,auVar153);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_a0,auVar11);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar90,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar18._4_4_ = fVar203 * fVar118;
      auVar18._0_4_ = fVar200 * fVar119;
      auVar18._8_4_ = fVar204 * fVar119;
      auVar18._12_4_ = fVar205 * fVar118;
      auVar18._16_4_ = fVar206 * fVar119;
      auVar18._20_4_ = fVar207 * fVar118;
      auVar18._24_4_ = fVar208 * fVar119;
      auVar18._28_4_ = auVar90._28_4_;
      auVar20 = vfmadd231ps_fma(auVar18,auVar113,local_c0);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar180,local_a0);
      auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar12,local_80);
      auVar115._4_4_ = fVar199 * fVar199;
      auVar115._0_4_ = fVar195 * fVar195;
      auVar115._8_4_ = fVar214 * fVar214;
      auVar115._12_4_ = fVar215 * fVar215;
      auVar115._16_4_ = fVar216 * fVar216;
      auVar115._20_4_ = fVar217 * fVar217;
      auVar115._24_4_ = fVar175 * fVar175;
      auVar115._28_4_ = auVar19._4_4_;
      auVar19 = vfmadd231ps_fma(auVar115,_local_420,_local_420);
      auVar18 = vmaxps_avx(ZEXT1632(auVar89),ZEXT1632(auVar20));
      auVar160._4_4_ = auVar18._4_4_ * auVar18._4_4_ * auVar19._4_4_;
      auVar160._0_4_ = auVar18._0_4_ * auVar18._0_4_ * auVar19._0_4_;
      auVar160._8_4_ = auVar18._8_4_ * auVar18._8_4_ * auVar19._8_4_;
      auVar160._12_4_ = auVar18._12_4_ * auVar18._12_4_ * auVar19._12_4_;
      auVar160._16_4_ = auVar18._16_4_ * auVar18._16_4_ * 0.0;
      auVar160._20_4_ = auVar18._20_4_ * auVar18._20_4_ * 0.0;
      auVar160._24_4_ = auVar18._24_4_ * auVar18._24_4_ * 0.0;
      auVar160._28_4_ = auVar18._28_4_;
      auVar167._4_4_ = auVar92._4_4_ * auVar92._4_4_;
      auVar167._0_4_ = auVar92._0_4_ * auVar92._0_4_;
      auVar167._8_4_ = auVar92._8_4_ * auVar92._8_4_;
      auVar167._12_4_ = auVar92._12_4_ * auVar92._12_4_;
      auVar167._16_4_ = auVar92._16_4_ * auVar92._16_4_;
      auVar167._20_4_ = auVar92._20_4_ * auVar92._20_4_;
      auVar167._24_4_ = auVar92._24_4_ * auVar92._24_4_;
      auVar167._28_4_ = auVar92._28_4_;
      auVar18 = vcmpps_avx(auVar167,auVar160,2);
      fVar119 = auVar23._0_4_ * 4.7683716e-07;
      auVar93._0_4_ = (float)iVar14;
      local_3c0._4_12_ = auVar86._4_12_;
      local_3c0._0_4_ = auVar93._0_4_;
      local_3c0._16_16_ = auVar158._16_16_;
      auVar93._4_4_ = auVar93._0_4_;
      auVar93._8_4_ = auVar93._0_4_;
      auVar93._12_4_ = auVar93._0_4_;
      auVar93._16_4_ = auVar93._0_4_;
      auVar93._20_4_ = auVar93._0_4_;
      auVar93._24_4_ = auVar93._0_4_;
      auVar93._28_4_ = auVar93._0_4_;
      auVar158 = vcmpps_avx(_DAT_02020f40,auVar93,1);
      auVar19 = vpermilps_avx(auVar22,0xaa);
      uVar104 = auVar19._0_8_;
      local_640._8_8_ = uVar104;
      local_640._0_8_ = uVar104;
      local_640._16_8_ = uVar104;
      local_640._24_8_ = uVar104;
      auVar23 = vpermilps_avx(auVar87,0xaa);
      uVar104 = auVar23._0_8_;
      auVar143._8_8_ = uVar104;
      auVar143._0_8_ = uVar104;
      auVar143._16_8_ = uVar104;
      auVar143._24_8_ = uVar104;
      auVar23 = vshufps_avx(auVar86,auVar86,0xaa);
      uVar104 = auVar23._0_8_;
      local_380._8_8_ = uVar104;
      local_380._0_8_ = uVar104;
      local_380._16_8_ = uVar104;
      local_380._24_8_ = uVar104;
      auVar23 = vshufps_avx(auVar120,auVar120,0xaa);
      local_440 = auVar23._0_8_;
      auVar92 = auVar158 & auVar18;
      uVar76 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      local_700._0_16_ = ZEXT416(uVar76);
      uStack_438 = local_440;
      uStack_430 = local_440;
      uStack_428 = local_440;
      fStack_4d8 = local_4e0;
      fStack_4d4 = fStack_4dc;
      fStack_4d0 = local_4e0;
      fStack_4cc = fStack_4dc;
      fStack_4c8 = local_4e0;
      fStack_4c4 = fStack_4dc;
      if ((((((((auVar92 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar92 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar92 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar92 >> 0x7f,0) == '\0') &&
            (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar92 >> 0xbf,0) == '\0') &&
          (auVar92 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar92[0x1f])
      {
        uVar79 = 0;
        auVar130 = ZEXT3264(auVar125);
        auVar117 = ZEXT3264(local_620);
        auVar135 = ZEXT3264(local_600);
        auVar174 = ZEXT3264(local_5e0);
        auVar162 = ZEXT3264(CONCAT428(local_540,
                                      CONCAT424(local_540,
                                                CONCAT420(local_540,
                                                          CONCAT416(local_540,
                                                                    CONCAT412(local_540,
                                                                              CONCAT48(local_540,
                                                                                       CONCAT44(
                                                  local_540,local_540))))))));
        auVar181 = ZEXT3264(CONCAT428(fStack_4dc,
                                      CONCAT424(local_4e0,
                                                CONCAT420(fStack_4dc,
                                                          CONCAT416(local_4e0,
                                                                    CONCAT412(fStack_4dc,
                                                                              CONCAT48(local_4e0,
                                                                                       uVar83)))))))
        ;
        auVar168 = ZEXT3264(local_560);
        auVar213 = ZEXT3264(local_720);
      }
      else {
        _local_320 = vandps_avx(auVar18,auVar158);
        fVar195 = auVar23._0_4_;
        fVar199 = auVar23._4_4_;
        auVar158._4_4_ = fVar199 * fVar203;
        auVar158._0_4_ = fVar195 * fVar200;
        auVar158._8_4_ = fVar195 * fVar204;
        auVar158._12_4_ = fVar199 * fVar205;
        auVar158._16_4_ = fVar195 * fVar206;
        auVar158._20_4_ = fVar199 * fVar207;
        auVar158._24_4_ = fVar195 * fVar208;
        auVar158._28_4_ = local_320._28_4_;
        auVar23 = vfmadd213ps_fma(auVar113,local_380,auVar158);
        auVar23 = vfmadd213ps_fma(auVar180,auVar143,ZEXT1632(auVar23));
        auVar23 = vfmadd213ps_fma(auVar12,local_640,ZEXT1632(auVar23));
        local_400 = ZEXT1632(auVar23);
        local_300._0_4_ = auVar74._0_4_;
        local_300._4_4_ = auVar74._4_4_;
        fStack_2f8 = auVar74._8_4_;
        fStack_2f4 = auVar74._12_4_;
        fStack_2f0 = auVar74._16_4_;
        fStack_2ec = auVar74._20_4_;
        fStack_2e8 = auVar74._24_4_;
        auVar26._4_4_ = fVar199 * (float)local_300._4_4_;
        auVar26._0_4_ = fVar195 * (float)local_300._0_4_;
        auVar26._8_4_ = fVar195 * fStack_2f8;
        auVar26._12_4_ = fVar199 * fStack_2f4;
        auVar26._16_4_ = fVar195 * fStack_2f0;
        auVar26._20_4_ = fVar199 * fStack_2ec;
        auVar26._24_4_ = fVar195 * fStack_2e8;
        auVar26._28_4_ = local_320._28_4_;
        auVar23 = vfmadd213ps_fma(auVar153,local_380,auVar26);
        auVar23 = vfmadd213ps_fma(auVar11,auVar143,ZEXT1632(auVar23));
        auVar158 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1210);
        auVar11 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar24 + 0x1b18);
        fVar118 = *(float *)(catmullrom_basis0 + lVar24 + 0x1f9c);
        fVar98 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa0);
        fVar99 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa4);
        fVar100 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fa8);
        fVar101 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fac);
        fVar102 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fb0);
        fVar103 = *(float *)(catmullrom_basis0 + lVar24 + 0x1fb4);
        auVar149._0_4_ = local_540 * fVar118;
        auVar149._4_4_ = local_540 * fVar98;
        auVar149._8_4_ = local_540 * fVar99;
        auVar149._12_4_ = local_540 * fVar100;
        auVar149._16_4_ = local_540 * fVar101;
        auVar149._20_4_ = local_540 * fVar102;
        auVar149._24_4_ = local_540 * fVar103;
        auVar149._28_4_ = 0;
        auVar172._0_4_ = local_4e0 * fVar118;
        auVar172._4_4_ = fStack_4dc * fVar98;
        auVar172._8_4_ = local_4e0 * fVar99;
        auVar172._12_4_ = fStack_4dc * fVar100;
        auVar172._16_4_ = local_4e0 * fVar101;
        auVar172._20_4_ = fStack_4dc * fVar102;
        auVar172._24_4_ = local_4e0 * fVar103;
        auVar172._28_4_ = 0;
        auVar27._4_4_ = fVar199 * fVar98;
        auVar27._0_4_ = fVar195 * fVar118;
        auVar27._8_4_ = fVar195 * fVar99;
        auVar27._12_4_ = fVar199 * fVar100;
        auVar27._16_4_ = fVar195 * fVar101;
        auVar27._20_4_ = fVar199 * fVar102;
        auVar27._24_4_ = fVar195 * fVar103;
        auVar27._28_4_ = fVar199;
        auStack_750 = auVar153._16_16_;
        local_760 = ZEXT416((uint)fVar119);
        auVar21 = vfmadd231ps_fma(auVar149,auVar113,local_600);
        auVar22 = vfmadd231ps_fma(auVar172,auVar113,local_5e0);
        auVar87 = vfmadd231ps_fma(auVar27,local_380,auVar113);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar11,local_560);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar11,local_620);
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar143,auVar11);
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar158,local_720);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar158,local_3a0);
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_640,auVar158);
        fVar118 = *(float *)(catmullrom_basis1 + lVar24 + 0x1f9c);
        fVar98 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa0);
        fVar99 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa4);
        fVar100 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fa8);
        fVar101 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fac);
        fVar102 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fb0);
        fVar103 = *(float *)(catmullrom_basis1 + lVar24 + 0x1fb4);
        auVar11._4_4_ = local_540 * fVar98;
        auVar11._0_4_ = local_540 * fVar118;
        auVar11._8_4_ = local_540 * fVar99;
        auVar11._12_4_ = local_540 * fVar100;
        auVar11._16_4_ = local_540 * fVar101;
        auVar11._20_4_ = local_540 * fVar102;
        auVar11._24_4_ = local_540 * fVar103;
        auVar11._28_4_ = local_540;
        auVar153._4_4_ = fStack_4dc * fVar98;
        auVar153._0_4_ = local_4e0 * fVar118;
        auVar153._8_4_ = local_4e0 * fVar99;
        auVar153._12_4_ = fStack_4dc * fVar100;
        auVar153._16_4_ = local_4e0 * fVar101;
        auVar153._20_4_ = fStack_4dc * fVar102;
        auVar153._24_4_ = local_4e0 * fVar103;
        auVar153._28_4_ = fStack_4dc;
        auVar28._4_4_ = fVar98 * fVar199;
        auVar28._0_4_ = fVar118 * fVar195;
        auVar28._8_4_ = fVar99 * fVar195;
        auVar28._12_4_ = fVar100 * fVar199;
        auVar28._16_4_ = fVar101 * fVar195;
        auVar28._20_4_ = fVar102 * fVar199;
        auVar28._24_4_ = fVar103 * fVar195;
        auVar28._28_4_ = auVar19._4_4_;
        auVar158 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1b18);
        auVar19 = vfmadd231ps_fma(auVar11,auVar158,local_600);
        auVar86 = vfmadd231ps_fma(auVar153,auVar158,local_5e0);
        auVar120 = vfmadd231ps_fma(auVar28,auVar158,local_380);
        auVar158 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1694);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar158,local_560);
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar158,local_620);
        local_480 = auVar143;
        auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar143,auVar158);
        auVar158 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar24 + 0x1210);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar158,local_720);
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar158,local_3a0);
        auVar110._8_4_ = 0x7fffffff;
        auVar110._0_8_ = 0x7fffffff7fffffff;
        auVar110._12_4_ = 0x7fffffff;
        auVar110._16_4_ = 0x7fffffff;
        auVar110._20_4_ = 0x7fffffff;
        auVar110._24_4_ = 0x7fffffff;
        auVar110._28_4_ = 0x7fffffff;
        auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),local_640,auVar158);
        auVar158 = vandps_avx(ZEXT1632(auVar21),auVar110);
        auVar11 = vandps_avx(ZEXT1632(auVar22),auVar110);
        auVar11 = vmaxps_avx(auVar158,auVar11);
        auVar158 = vandps_avx(ZEXT1632(auVar87),auVar110);
        auVar158 = vmaxps_avx(auVar11,auVar158);
        auVar127._4_4_ = fVar119;
        auVar127._0_4_ = fVar119;
        auVar127._8_4_ = fVar119;
        auVar127._12_4_ = fVar119;
        auVar127._16_4_ = fVar119;
        auVar127._20_4_ = fVar119;
        auVar127._24_4_ = fVar119;
        auVar127._28_4_ = fVar119;
        auVar158 = vcmpps_avx(auVar158,auVar127,1);
        auVar153 = vblendvps_avx(ZEXT1632(auVar21),_local_420,auVar158);
        auVar113 = vblendvps_avx(ZEXT1632(auVar22),auVar97,auVar158);
        auVar158 = vandps_avx(ZEXT1632(auVar19),auVar110);
        auVar11 = vandps_avx(ZEXT1632(auVar86),auVar110);
        auVar180 = vmaxps_avx(auVar158,auVar11);
        auVar158 = vandps_avx(ZEXT1632(auVar120),auVar110);
        auVar158 = vmaxps_avx(auVar180,auVar158);
        auVar12 = vcmpps_avx(auVar158,auVar127,1);
        auVar158 = vblendvps_avx(ZEXT1632(auVar19),_local_420,auVar12);
        auVar180 = vblendvps_avx(ZEXT1632(auVar86),auVar97,auVar12);
        auVar23 = vfmadd213ps_fma(auVar90,local_640,ZEXT1632(auVar23));
        auVar19 = vfmadd213ps_fma(auVar153,auVar153,ZEXT832(0) << 0x20);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar113,auVar113);
        auVar90 = vrsqrtps_avx(ZEXT1632(auVar19));
        fVar118 = auVar90._0_4_;
        fVar98 = auVar90._4_4_;
        fVar99 = auVar90._8_4_;
        fVar100 = auVar90._12_4_;
        fVar101 = auVar90._16_4_;
        fVar102 = auVar90._20_4_;
        fVar103 = auVar90._24_4_;
        auVar29._4_4_ = fVar98 * fVar98 * fVar98 * auVar19._4_4_ * -0.5;
        auVar29._0_4_ = fVar118 * fVar118 * fVar118 * auVar19._0_4_ * -0.5;
        auVar29._8_4_ = fVar99 * fVar99 * fVar99 * auVar19._8_4_ * -0.5;
        auVar29._12_4_ = fVar100 * fVar100 * fVar100 * auVar19._12_4_ * -0.5;
        auVar29._16_4_ = fVar101 * fVar101 * fVar101 * -0.0;
        auVar29._20_4_ = fVar102 * fVar102 * fVar102 * -0.0;
        auVar29._24_4_ = fVar103 * fVar103 * fVar103 * -0.0;
        auVar29._28_4_ = auVar11._28_4_;
        auVar211._8_4_ = 0x3fc00000;
        auVar211._0_8_ = 0x3fc000003fc00000;
        auVar211._12_4_ = 0x3fc00000;
        auVar211._16_4_ = 0x3fc00000;
        auVar211._20_4_ = 0x3fc00000;
        auVar211._24_4_ = 0x3fc00000;
        auVar211._28_4_ = 0x3fc00000;
        auVar19 = vfmadd231ps_fma(auVar29,auVar211,auVar90);
        fVar118 = auVar19._0_4_;
        fVar98 = auVar19._4_4_;
        auVar30._4_4_ = fVar98 * auVar113._4_4_;
        auVar30._0_4_ = fVar118 * auVar113._0_4_;
        fVar99 = auVar19._8_4_;
        auVar30._8_4_ = fVar99 * auVar113._8_4_;
        fVar100 = auVar19._12_4_;
        auVar30._12_4_ = fVar100 * auVar113._12_4_;
        auVar30._16_4_ = auVar113._16_4_ * 0.0;
        auVar30._20_4_ = auVar113._20_4_ * 0.0;
        auVar30._24_4_ = auVar113._24_4_ * 0.0;
        auVar30._28_4_ = 0;
        auVar31._4_4_ = fVar98 * -auVar153._4_4_;
        auVar31._0_4_ = fVar118 * -auVar153._0_4_;
        auVar31._8_4_ = fVar99 * -auVar153._8_4_;
        auVar31._12_4_ = fVar100 * -auVar153._12_4_;
        auVar31._16_4_ = -auVar153._16_4_ * 0.0;
        auVar31._20_4_ = -auVar153._20_4_ * 0.0;
        auVar31._24_4_ = -auVar153._24_4_ * 0.0;
        auVar31._28_4_ = auVar90._28_4_;
        auVar19 = vfmadd213ps_fma(auVar158,auVar158,ZEXT832(0) << 0x20);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar180,auVar180);
        auVar11 = vrsqrtps_avx(ZEXT1632(auVar19));
        auVar32._28_4_ = auVar12._28_4_;
        auVar32._0_28_ =
             ZEXT1628(CONCAT412(fVar100 * 0.0,
                                CONCAT48(fVar99 * 0.0,CONCAT44(fVar98 * 0.0,fVar118 * 0.0))));
        fVar118 = auVar11._0_4_;
        fVar98 = auVar11._4_4_;
        fVar99 = auVar11._8_4_;
        fVar100 = auVar11._12_4_;
        fVar101 = auVar11._16_4_;
        fVar102 = auVar11._20_4_;
        fVar103 = auVar11._24_4_;
        auVar33._4_4_ = fVar98 * fVar98 * fVar98 * auVar19._4_4_ * -0.5;
        auVar33._0_4_ = fVar118 * fVar118 * fVar118 * auVar19._0_4_ * -0.5;
        auVar33._8_4_ = fVar99 * fVar99 * fVar99 * auVar19._8_4_ * -0.5;
        auVar33._12_4_ = fVar100 * fVar100 * fVar100 * auVar19._12_4_ * -0.5;
        auVar33._16_4_ = fVar101 * fVar101 * fVar101 * -0.0;
        auVar33._20_4_ = fVar102 * fVar102 * fVar102 * -0.0;
        auVar33._24_4_ = fVar103 * fVar103 * fVar103 * -0.0;
        auVar33._28_4_ = 0;
        auVar19 = vfmadd231ps_fma(auVar33,auVar211,auVar11);
        fVar118 = auVar19._0_4_;
        auVar190._0_4_ = auVar180._0_4_ * fVar118;
        fVar98 = auVar19._4_4_;
        auVar190._4_4_ = auVar180._4_4_ * fVar98;
        fVar99 = auVar19._8_4_;
        auVar190._8_4_ = auVar180._8_4_ * fVar99;
        fVar100 = auVar19._12_4_;
        auVar190._12_4_ = auVar180._12_4_ * fVar100;
        auVar190._16_4_ = auVar180._16_4_ * 0.0;
        auVar190._20_4_ = auVar180._20_4_ * 0.0;
        auVar190._24_4_ = auVar180._24_4_ * 0.0;
        auVar190._28_4_ = 0;
        auVar34._4_4_ = -auVar158._4_4_ * fVar98;
        auVar34._0_4_ = -auVar158._0_4_ * fVar118;
        auVar34._8_4_ = -auVar158._8_4_ * fVar99;
        auVar34._12_4_ = -auVar158._12_4_ * fVar100;
        auVar34._16_4_ = -auVar158._16_4_ * 0.0;
        auVar34._20_4_ = -auVar158._20_4_ * 0.0;
        auVar34._24_4_ = -auVar158._24_4_ * 0.0;
        auVar34._28_4_ = auVar180._28_4_;
        auVar35._28_4_ = auVar11._28_4_;
        auVar35._0_28_ =
             ZEXT1628(CONCAT412(fVar100 * 0.0,
                                CONCAT48(fVar99 * 0.0,CONCAT44(fVar98 * 0.0,fVar118 * 0.0))));
        auVar19 = vfmadd213ps_fma(auVar30,ZEXT1632(auVar89),auVar156);
        auVar158 = ZEXT1632(auVar89);
        auVar21 = vfmadd213ps_fma(auVar31,auVar158,auVar91);
        auVar22 = vfmadd213ps_fma(auVar32,auVar158,ZEXT1632(auVar23));
        auVar106 = vfnmadd213ps_fma(auVar30,auVar158,auVar156);
        auVar87 = vfmadd213ps_fma(auVar190,ZEXT1632(auVar20),auVar108);
        auVar85 = vfnmadd213ps_fma(auVar31,auVar158,auVar91);
        auVar158 = ZEXT1632(auVar20);
        auVar86 = vfmadd213ps_fma(auVar34,auVar158,auVar126);
        local_7a0._0_32_ = ZEXT1632(auVar89);
        auVar137 = vfnmadd231ps_fma(ZEXT1632(auVar23),local_7a0._0_32_,auVar32);
        auVar89 = vfmadd213ps_fma(auVar35,auVar158,local_400);
        auVar107 = vfnmadd213ps_fma(auVar190,auVar158,auVar108);
        auVar131 = vfnmadd213ps_fma(auVar34,auVar158,auVar126);
        auVar84 = vfnmadd231ps_fma(local_400,ZEXT1632(auVar20),auVar35);
        auVar158 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar85));
        auVar11 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar137));
        auVar91._4_4_ = auVar137._4_4_ * auVar158._4_4_;
        auVar91._0_4_ = auVar137._0_4_ * auVar158._0_4_;
        auVar91._8_4_ = auVar137._8_4_ * auVar158._8_4_;
        auVar91._12_4_ = auVar137._12_4_ * auVar158._12_4_;
        auVar91._16_4_ = auVar158._16_4_ * 0.0;
        auVar91._20_4_ = auVar158._20_4_ * 0.0;
        auVar91._24_4_ = auVar158._24_4_ * 0.0;
        auVar91._28_4_ = 0;
        auVar120 = vfmsub231ps_fma(auVar91,ZEXT1632(auVar85),auVar11);
        auVar108._4_4_ = auVar11._4_4_ * auVar106._4_4_;
        auVar108._0_4_ = auVar11._0_4_ * auVar106._0_4_;
        auVar108._8_4_ = auVar11._8_4_ * auVar106._8_4_;
        auVar108._12_4_ = auVar11._12_4_ * auVar106._12_4_;
        auVar108._16_4_ = auVar11._16_4_ * 0.0;
        auVar108._20_4_ = auVar11._20_4_ * 0.0;
        auVar108._24_4_ = auVar11._24_4_ * 0.0;
        auVar108._28_4_ = auVar11._28_4_;
        auVar11 = vsubps_avx(ZEXT1632(auVar87),ZEXT1632(auVar106));
        auVar23 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar137),auVar11);
        auVar126._4_4_ = auVar85._4_4_ * auVar11._4_4_;
        auVar126._0_4_ = auVar85._0_4_ * auVar11._0_4_;
        auVar126._8_4_ = auVar85._8_4_ * auVar11._8_4_;
        auVar126._12_4_ = auVar85._12_4_ * auVar11._12_4_;
        auVar126._16_4_ = auVar11._16_4_ * 0.0;
        auVar126._20_4_ = auVar11._20_4_ * 0.0;
        auVar126._24_4_ = auVar11._24_4_ * 0.0;
        auVar126._28_4_ = auVar11._28_4_;
        auVar113 = ZEXT1632(auVar106);
        auVar106 = vfmsub231ps_fma(auVar126,auVar113,auVar158);
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar106),ZEXT832(0) << 0x20,ZEXT1632(auVar23));
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),ZEXT832(0) << 0x20,ZEXT1632(auVar120));
        auVar18 = vcmpps_avx(ZEXT1632(auVar23),ZEXT832(0) << 0x20,2);
        local_680 = vblendvps_avx(ZEXT1632(auVar107),ZEXT1632(auVar19),auVar18);
        auVar158 = vblendvps_avx(ZEXT1632(auVar131),ZEXT1632(auVar21),auVar18);
        local_580 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar22),auVar18);
        auVar11 = vblendvps_avx(auVar113,ZEXT1632(auVar87),auVar18);
        auVar153 = vblendvps_avx(ZEXT1632(auVar85),ZEXT1632(auVar86),auVar18);
        auVar90 = vblendvps_avx(ZEXT1632(auVar137),ZEXT1632(auVar89),auVar18);
        auVar113 = vblendvps_avx(ZEXT1632(auVar87),auVar113,auVar18);
        auVar180 = vblendvps_avx(ZEXT1632(auVar86),ZEXT1632(auVar85),auVar18);
        auVar23 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
        local_660 = ZEXT1632(auVar23);
        auVar12 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar137),auVar18);
        auVar92 = vsubps_avx(auVar113,local_680);
        auVar115 = vsubps_avx(auVar180,auVar158);
        auVar160 = vsubps_avx(auVar12,local_580);
        auVar167 = vsubps_avx(local_680,auVar11);
        auVar91 = vsubps_avx(auVar158,auVar153);
        auVar108 = vsubps_avx(local_580,auVar90);
        auVar156._4_4_ = auVar160._4_4_ * local_680._4_4_;
        auVar156._0_4_ = auVar160._0_4_ * local_680._0_4_;
        auVar156._8_4_ = auVar160._8_4_ * local_680._8_4_;
        auVar156._12_4_ = auVar160._12_4_ * local_680._12_4_;
        auVar156._16_4_ = auVar160._16_4_ * local_680._16_4_;
        auVar156._20_4_ = auVar160._20_4_ * local_680._20_4_;
        auVar156._24_4_ = auVar160._24_4_ * local_680._24_4_;
        auVar156._28_4_ = auVar12._28_4_;
        auVar19 = vfmsub231ps_fma(auVar156,local_580,auVar92);
        auVar36._4_4_ = auVar92._4_4_ * auVar158._4_4_;
        auVar36._0_4_ = auVar92._0_4_ * auVar158._0_4_;
        auVar36._8_4_ = auVar92._8_4_ * auVar158._8_4_;
        auVar36._12_4_ = auVar92._12_4_ * auVar158._12_4_;
        auVar36._16_4_ = auVar92._16_4_ * auVar158._16_4_;
        auVar36._20_4_ = auVar92._20_4_ * auVar158._20_4_;
        auVar36._24_4_ = auVar92._24_4_ * auVar158._24_4_;
        auVar36._28_4_ = auVar113._28_4_;
        auVar89 = vfmsub231ps_fma(auVar36,local_680,auVar115);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
        auVar94._0_4_ = auVar115._0_4_ * local_580._0_4_;
        auVar94._4_4_ = auVar115._4_4_ * local_580._4_4_;
        auVar94._8_4_ = auVar115._8_4_ * local_580._8_4_;
        auVar94._12_4_ = auVar115._12_4_ * local_580._12_4_;
        auVar94._16_4_ = auVar115._16_4_ * local_580._16_4_;
        auVar94._20_4_ = auVar115._20_4_ * local_580._20_4_;
        auVar94._24_4_ = auVar115._24_4_ * local_580._24_4_;
        auVar94._28_4_ = 0;
        auVar89 = vfmsub231ps_fma(auVar94,auVar158,auVar160);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar89));
        auVar95._0_4_ = auVar108._0_4_ * auVar11._0_4_;
        auVar95._4_4_ = auVar108._4_4_ * auVar11._4_4_;
        auVar95._8_4_ = auVar108._8_4_ * auVar11._8_4_;
        auVar95._12_4_ = auVar108._12_4_ * auVar11._12_4_;
        auVar95._16_4_ = auVar108._16_4_ * auVar11._16_4_;
        auVar95._20_4_ = auVar108._20_4_ * auVar11._20_4_;
        auVar95._24_4_ = auVar108._24_4_ * auVar11._24_4_;
        auVar95._28_4_ = 0;
        auVar19 = vfmsub231ps_fma(auVar95,auVar167,auVar90);
        auVar37._4_4_ = auVar91._4_4_ * auVar90._4_4_;
        auVar37._0_4_ = auVar91._0_4_ * auVar90._0_4_;
        auVar37._8_4_ = auVar91._8_4_ * auVar90._8_4_;
        auVar37._12_4_ = auVar91._12_4_ * auVar90._12_4_;
        auVar37._16_4_ = auVar91._16_4_ * auVar90._16_4_;
        auVar37._20_4_ = auVar91._20_4_ * auVar90._20_4_;
        auVar37._24_4_ = auVar91._24_4_ * auVar90._24_4_;
        auVar37._28_4_ = auVar90._28_4_;
        auVar21 = vfmsub231ps_fma(auVar37,auVar153,auVar108);
        auVar38._4_4_ = auVar167._4_4_ * auVar153._4_4_;
        auVar38._0_4_ = auVar167._0_4_ * auVar153._0_4_;
        auVar38._8_4_ = auVar167._8_4_ * auVar153._8_4_;
        auVar38._12_4_ = auVar167._12_4_ * auVar153._12_4_;
        auVar38._16_4_ = auVar167._16_4_ * auVar153._16_4_;
        auVar38._20_4_ = auVar167._20_4_ * auVar153._20_4_;
        auVar38._24_4_ = auVar167._24_4_ * auVar153._24_4_;
        auVar38._28_4_ = auVar180._28_4_;
        auVar22 = vfmsub231ps_fma(auVar38,auVar91,auVar11);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
        auVar11 = vmaxps_avx(ZEXT1632(auVar89),ZEXT1632(auVar21));
        auVar11 = vcmpps_avx(auVar11,ZEXT832(0) << 0x20,2);
        auVar19 = vpackssdw_avx(auVar11._0_16_,auVar11._16_16_);
        auVar23 = vpand_avx(auVar19,auVar23);
        auVar11 = vpmovsxwd_avx2(auVar23);
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar11 >> 0x7f,0) == '\0') &&
              (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0xbf,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar11[0x1f]) {
LAB_016c7571:
          auVar145._8_8_ = uStack_458;
          auVar145._0_8_ = local_460;
          auVar145._16_8_ = uStack_450;
          auVar145._24_8_ = uStack_448;
          auVar117 = ZEXT3264(auVar125);
          auVar125._8_4_ = local_4e0;
          auVar125._0_8_ = uVar83;
          auVar125._12_4_ = fStack_4dc;
          auVar125._16_4_ = local_4e0;
          auVar125._20_4_ = fStack_4dc;
          auVar125._24_4_ = local_4e0;
          auVar125._28_4_ = fStack_4dc;
        }
        else {
          auVar39._4_4_ = auVar115._4_4_ * auVar108._4_4_;
          auVar39._0_4_ = auVar115._0_4_ * auVar108._0_4_;
          auVar39._8_4_ = auVar115._8_4_ * auVar108._8_4_;
          auVar39._12_4_ = auVar115._12_4_ * auVar108._12_4_;
          auVar39._16_4_ = auVar115._16_4_ * auVar108._16_4_;
          auVar39._20_4_ = auVar115._20_4_ * auVar108._20_4_;
          auVar39._24_4_ = auVar115._24_4_ * auVar108._24_4_;
          auVar39._28_4_ = auVar11._28_4_;
          auVar86 = vfmsub231ps_fma(auVar39,auVar91,auVar160);
          auVar111._0_4_ = auVar160._0_4_ * auVar167._0_4_;
          auVar111._4_4_ = auVar160._4_4_ * auVar167._4_4_;
          auVar111._8_4_ = auVar160._8_4_ * auVar167._8_4_;
          auVar111._12_4_ = auVar160._12_4_ * auVar167._12_4_;
          auVar111._16_4_ = auVar160._16_4_ * auVar167._16_4_;
          auVar111._20_4_ = auVar160._20_4_ * auVar167._20_4_;
          auVar111._24_4_ = auVar160._24_4_ * auVar167._24_4_;
          auVar111._28_4_ = 0;
          auVar87 = vfmsub231ps_fma(auVar111,auVar92,auVar108);
          auVar40._4_4_ = auVar92._4_4_ * auVar91._4_4_;
          auVar40._0_4_ = auVar92._0_4_ * auVar91._0_4_;
          auVar40._8_4_ = auVar92._8_4_ * auVar91._8_4_;
          auVar40._12_4_ = auVar92._12_4_ * auVar91._12_4_;
          auVar40._16_4_ = auVar92._16_4_ * auVar91._16_4_;
          auVar40._20_4_ = auVar92._20_4_ * auVar91._20_4_;
          auVar40._24_4_ = auVar92._24_4_ * auVar91._24_4_;
          auVar40._28_4_ = auVar153._28_4_;
          auVar120 = vfmsub231ps_fma(auVar40,auVar167,auVar115);
          auVar19 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar87),ZEXT1632(auVar120));
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT1632(auVar86),_DAT_02020f00);
          auVar11 = vrcpps_avx(ZEXT1632(auVar22));
          auVar191._8_4_ = 0x3f800000;
          auVar191._0_8_ = &DAT_3f8000003f800000;
          auVar191._12_4_ = 0x3f800000;
          auVar191._16_4_ = 0x3f800000;
          auVar191._20_4_ = 0x3f800000;
          auVar191._24_4_ = 0x3f800000;
          auVar191._28_4_ = 0x3f800000;
          auVar19 = vfnmadd213ps_fma(auVar11,ZEXT1632(auVar22),auVar191);
          auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar11,auVar11);
          auVar159._0_4_ = auVar120._0_4_ * local_580._0_4_;
          auVar159._4_4_ = auVar120._4_4_ * local_580._4_4_;
          auVar159._8_4_ = auVar120._8_4_ * local_580._8_4_;
          auVar159._12_4_ = auVar120._12_4_ * local_580._12_4_;
          auVar159._16_4_ = local_580._16_4_ * 0.0;
          auVar159._20_4_ = local_580._20_4_ * 0.0;
          auVar159._24_4_ = local_580._24_4_ * 0.0;
          auVar159._28_4_ = 0;
          auVar87 = vfmadd231ps_fma(auVar159,auVar158,ZEXT1632(auVar87));
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),ZEXT1632(auVar86),local_680);
          fVar98 = auVar19._0_4_;
          fVar99 = auVar19._4_4_;
          fVar100 = auVar19._8_4_;
          fVar101 = auVar19._12_4_;
          auVar153 = ZEXT1632(CONCAT412(fVar101 * auVar87._12_4_,
                                        CONCAT48(fVar100 * auVar87._8_4_,
                                                 CONCAT44(fVar99 * auVar87._4_4_,
                                                          fVar98 * auVar87._0_4_))));
          auVar96._4_4_ = uVar76;
          auVar96._0_4_ = uVar76;
          auVar96._8_4_ = uVar76;
          auVar96._12_4_ = uVar76;
          auVar96._16_4_ = uVar76;
          auVar96._20_4_ = uVar76;
          auVar96._24_4_ = uVar76;
          auVar96._28_4_ = uVar76;
          fVar118 = ray->tfar;
          auVar112._4_4_ = fVar118;
          auVar112._0_4_ = fVar118;
          auVar112._8_4_ = fVar118;
          auVar112._12_4_ = fVar118;
          auVar112._16_4_ = fVar118;
          auVar112._20_4_ = fVar118;
          auVar112._24_4_ = fVar118;
          auVar112._28_4_ = fVar118;
          auVar158 = vcmpps_avx(auVar96,auVar153,2);
          auVar11 = vcmpps_avx(auVar153,auVar112,2);
          auVar158 = vandps_avx(auVar11,auVar158);
          auVar19 = vpackssdw_avx(auVar158._0_16_,auVar158._16_16_);
          auVar23 = vpand_avx(auVar23,auVar19);
          auVar158 = vpmovsxwd_avx2(auVar23);
          if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar158 >> 0x7f,0) == '\0') &&
                (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar158 >> 0xbf,0) == '\0') &&
              (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar158[0x1f]) goto LAB_016c7571;
          auVar158 = vcmpps_avx(ZEXT1632(auVar22),ZEXT832(0) << 0x20,4);
          auVar19 = vpackssdw_avx(auVar158._0_16_,auVar158._16_16_);
          auVar23 = vpand_avx(auVar23,auVar19);
          auVar158 = vpmovsxwd_avx2(auVar23);
          auVar145._8_8_ = uStack_458;
          auVar145._0_8_ = local_460;
          auVar145._16_8_ = uStack_450;
          auVar145._24_8_ = uStack_448;
          auVar117 = ZEXT3264(auVar125);
          auVar125._8_4_ = local_4e0;
          auVar125._0_8_ = uVar83;
          auVar125._12_4_ = fStack_4dc;
          auVar125._16_4_ = local_4e0;
          auVar125._20_4_ = fStack_4dc;
          auVar125._24_4_ = local_4e0;
          auVar125._28_4_ = fStack_4dc;
          if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar158 >> 0x7f,0) != '\0') ||
                (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar158 >> 0xbf,0) != '\0') ||
              (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar158[0x1f] < '\0') {
            auVar90 = ZEXT1632(CONCAT412(fVar101 * auVar89._12_4_,
                                         CONCAT48(fVar100 * auVar89._8_4_,
                                                  CONCAT44(fVar99 * auVar89._4_4_,
                                                           fVar98 * auVar89._0_4_))));
            auVar113 = ZEXT1632(CONCAT412(fVar101 * auVar21._12_4_,
                                          CONCAT48(fVar100 * auVar21._8_4_,
                                                   CONCAT44(fVar99 * auVar21._4_4_,
                                                            fVar98 * auVar21._0_4_))));
            auVar144._8_4_ = 0x3f800000;
            auVar144._0_8_ = &DAT_3f8000003f800000;
            auVar144._12_4_ = 0x3f800000;
            auVar144._16_4_ = 0x3f800000;
            auVar144._20_4_ = 0x3f800000;
            auVar144._24_4_ = 0x3f800000;
            auVar144._28_4_ = 0x3f800000;
            auVar11 = vsubps_avx(auVar144,auVar90);
            _local_140 = vblendvps_avx(auVar11,auVar90,auVar18);
            auVar11 = vsubps_avx(auVar144,auVar113);
            local_340 = vblendvps_avx(auVar11,auVar113,auVar18);
            auVar117 = ZEXT3264(auVar153);
            auVar145 = auVar158;
          }
        }
        auVar201 = ZEXT3264(local_640);
        auVar158 = auVar117._0_32_;
        if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar145 >> 0x7f,0) == '\0') &&
              (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar145 >> 0xbf,0) == '\0') &&
            (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar145[0x1f]) {
          uVar79 = 0;
          auVar162 = ZEXT3264(CONCAT428(local_540,
                                        CONCAT424(local_540,
                                                  CONCAT420(local_540,
                                                            CONCAT416(local_540,
                                                                      CONCAT412(local_540,
                                                                                CONCAT48(local_540,
                                                                                         CONCAT44(
                                                  local_540,local_540))))))));
          auVar168 = ZEXT3264(local_560);
          auVar174 = ZEXT3264(local_5e0);
          auVar181 = ZEXT3264(auVar125);
          auVar213 = ZEXT3264(local_720);
        }
        else {
          auVar11 = vsubps_avx(ZEXT1632(auVar20),local_7a0._0_32_);
          auVar23 = vfmadd213ps_fma(auVar11,_local_140,local_7a0._0_32_);
          fVar118 = pre->depth_scale;
          auVar41._4_4_ = (auVar23._4_4_ + auVar23._4_4_) * fVar118;
          auVar41._0_4_ = (auVar23._0_4_ + auVar23._0_4_) * fVar118;
          auVar41._8_4_ = (auVar23._8_4_ + auVar23._8_4_) * fVar118;
          auVar41._12_4_ = (auVar23._12_4_ + auVar23._12_4_) * fVar118;
          auVar41._16_4_ = fVar118 * 0.0;
          auVar41._20_4_ = fVar118 * 0.0;
          auVar41._24_4_ = fVar118 * 0.0;
          auVar41._28_4_ = 0;
          auVar130 = ZEXT3264(auVar158);
          auVar11 = vcmpps_avx(auVar158,auVar41,6);
          auVar153 = auVar145 & auVar11;
          auVar162 = ZEXT3264(CONCAT428(local_540,
                                        CONCAT424(local_540,
                                                  CONCAT420(local_540,
                                                            CONCAT416(local_540,
                                                                      CONCAT412(local_540,
                                                                                CONCAT48(local_540,
                                                                                         CONCAT44(
                                                  local_540,local_540))))))));
          auVar168 = ZEXT3264(local_560);
          auVar135 = ZEXT3264(auVar143);
          auVar174 = ZEXT3264(local_5e0);
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar153 >> 0x7f,0) == '\0') &&
                (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar153 >> 0xbf,0) == '\0') &&
              (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar153[0x1f]) {
            uVar79 = 0;
            auVar117 = ZEXT3264(local_620);
            auVar135 = ZEXT3264(local_600);
            auVar181 = ZEXT3264(auVar125);
            auVar213 = ZEXT3264(local_720);
            goto LAB_016c628d;
          }
          local_200 = vandps_avx(auVar11,auVar145);
          auVar114._8_4_ = 0xbf800000;
          auVar114._0_8_ = 0xbf800000bf800000;
          auVar114._12_4_ = 0xbf800000;
          auVar114._16_4_ = 0xbf800000;
          auVar114._20_4_ = 0xbf800000;
          auVar114._24_4_ = 0xbf800000;
          auVar114._28_4_ = 0xbf800000;
          auVar128._8_4_ = 0x40000000;
          auVar128._0_8_ = 0x4000000040000000;
          auVar128._12_4_ = 0x40000000;
          auVar128._16_4_ = 0x40000000;
          auVar128._20_4_ = 0x40000000;
          auVar128._24_4_ = 0x40000000;
          auVar128._28_4_ = 0x40000000;
          auVar23 = vfmadd213ps_fma(local_340,auVar128,auVar114);
          local_2c0 = _local_140;
          local_2a0 = ZEXT1632(auVar23);
          local_280 = auVar158;
          local_260 = 0;
          local_25c = iVar14;
          local_250 = *(undefined8 *)*pauVar1;
          uStack_248 = *(undefined8 *)(*pauVar1 + 8);
          local_240 = *(undefined8 *)*pauVar2;
          uStack_238 = *(undefined8 *)(*pauVar2 + 8);
          local_230 = *(undefined8 *)*pauVar3;
          uStack_228 = *(undefined8 *)(*pauVar3 + 8);
          local_220 = *(undefined8 *)*pauVar4;
          uStack_218 = *(undefined8 *)(*pauVar4 + 8);
          local_340 = ZEXT1632(auVar23);
          auVar11 = local_340;
          if ((pGVar15->mask & ray->mask) == 0) {
            uVar79 = 0;
            auVar181 = ZEXT3264(auVar125);
            auVar213 = ZEXT3264(local_720);
          }
          else {
            auVar181 = ZEXT3264(auVar125);
            auVar213 = ZEXT3264(local_720);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar79 = CONCAT71((int7)(uVar79 >> 8),1),
               pGVar15->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar118 = 1.0 / auVar93._0_4_;
              local_1e0[0] = fVar118 * ((float)local_140._0_4_ + 0.0);
              local_1e0[1] = fVar118 * ((float)local_140._4_4_ + 1.0);
              local_1e0[2] = fVar118 * (fStack_138 + 2.0);
              local_1e0[3] = fVar118 * (fStack_134 + 3.0);
              fStack_1d0 = fVar118 * (fStack_130 + 4.0);
              fStack_1cc = fVar118 * (fStack_12c + 5.0);
              fStack_1c8 = fVar118 * (fStack_128 + 6.0);
              fStack_1c4 = fStack_124 + 7.0;
              local_340._0_8_ = auVar23._0_8_;
              local_340._8_8_ = auVar23._8_8_;
              local_1c0 = local_340._0_8_;
              uStack_1b8 = local_340._8_8_;
              uStack_1b0 = 0;
              uStack_1a8 = 0;
              local_1a0 = auVar158;
              uVar76 = vmovmskps_avx(local_200);
              uVar79 = CONCAT71((int7)(uVar79 >> 8),uVar76 != 0);
              local_340 = auVar11;
              if (uVar76 == 0) {
                auVar201 = ZEXT3264(local_640);
                local_760._0_4_ = fVar119;
              }
              else {
                lVar81 = 0;
                uVar78 = (ulong)(uVar76 & 0xff);
                for (uVar77 = uVar78; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000)
                {
                  lVar81 = lVar81 + 1;
                }
                local_500 = ZEXT1632(*pauVar2);
                _local_520 = ZEXT1632(*pauVar3);
                auStack_3d0 = auVar97._16_16_;
                _local_3e0 = *pauVar4;
                local_6e0 = auVar158;
                auVar201 = ZEXT3264(local_640);
                local_7b0 = context;
                local_7a8 = ray;
                local_768 = pre;
                _local_300 = auVar109;
                do {
                  local_5b4 = local_1e0[lVar81];
                  local_5b0 = *(undefined4 *)((long)&local_1c0 + lVar81 * 4);
                  local_580._0_4_ = ray->tfar;
                  local_680._0_8_ = lVar81;
                  ray->tfar = *(float *)(local_1a0 + lVar81 * 4);
                  fVar119 = 1.0 - local_5b4;
                  auVar89 = ZEXT416((uint)local_5b4);
                  auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar89,
                                            ZEXT416(0xc0a00000));
                  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_5b4 * local_5b4 * 3.0)),
                                            ZEXT416((uint)(local_5b4 + local_5b4)),auVar23);
                  auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar89,
                                            ZEXT416(0x40000000));
                  auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * fVar119 * -3.0)),
                                            ZEXT416((uint)(fVar119 + fVar119)),auVar23);
                  auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(local_5b4 * (fVar119 + fVar119))),
                                             ZEXT416((uint)fVar119),ZEXT416((uint)fVar119));
                  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(local_5b4 * local_5b4)),auVar89,
                                            ZEXT416((uint)(fVar119 * -2.0)));
                  fVar119 = auVar23._0_4_ * 0.5;
                  fVar118 = auVar89._0_4_ * 0.5;
                  auVar139._0_4_ = fVar118 * (float)local_3e0._0_4_;
                  auVar139._4_4_ = fVar118 * (float)local_3e0._4_4_;
                  auVar139._8_4_ = fVar118 * fStack_3d8;
                  auVar139._12_4_ = fVar118 * fStack_3d4;
                  auVar121._4_4_ = fVar119;
                  auVar121._0_4_ = fVar119;
                  auVar121._8_4_ = fVar119;
                  auVar121._12_4_ = fVar119;
                  auVar23 = vfmadd132ps_fma(auVar121,auVar139,_local_520);
                  fVar119 = auVar19._0_4_ * 0.5;
                  auVar140._4_4_ = fVar119;
                  auVar140._0_4_ = fVar119;
                  auVar140._8_4_ = fVar119;
                  auVar140._12_4_ = fVar119;
                  auVar23 = vfmadd132ps_fma(auVar140,auVar23,local_500._0_16_);
                  fVar119 = auVar20._0_4_ * 0.5;
                  auVar122._4_4_ = fVar119;
                  auVar122._0_4_ = fVar119;
                  auVar122._8_4_ = fVar119;
                  auVar122._12_4_ = fVar119;
                  auVar70._8_8_ = uStack_6b8;
                  auVar70._0_8_ = local_6c0;
                  auVar23 = vfmadd132ps_fma(auVar122,auVar23,auVar70);
                  local_6b0.context = context->user;
                  local_5c0 = vmovlps_avx(auVar23);
                  local_5b8 = vextractps_avx(auVar23,2);
                  local_5ac = (int)local_588;
                  local_5a8 = (int)local_728;
                  local_5a4 = (local_6b0.context)->instID[0];
                  local_5a0 = (local_6b0.context)->instPrimID[0];
                  local_7b4 = -1;
                  local_6b0.valid = &local_7b4;
                  local_6b0.geometryUserPtr = pGVar15->userPtr;
                  local_6b0.ray = (RTCRayN *)ray;
                  local_6b0.hit = (RTCHitN *)&local_5c0;
                  local_6b0.N = 1;
                  local_7a0._0_4_ = (int)uVar79;
                  local_660._0_8_ = uVar78;
                  if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_016c66ab:
                    auVar143 = auVar135._0_32_;
                    auVar158 = auVar117._0_32_;
                    p_Var17 = context->args->filter;
                    if (p_Var17 == (RTCFilterFunctionN)0x0) break;
                    if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                       (((pGVar15->field_8).field_0x2 & 0x40) != 0)) {
                      (*p_Var17)(&local_6b0);
                      uVar79 = (ulong)(uint)local_7a0._0_4_;
                      auVar135 = ZEXT3264(local_480);
                      auVar201 = ZEXT3264(local_640);
                      auVar213 = ZEXT3264(local_720);
                      auVar181 = ZEXT3264(CONCAT428(fStack_4c4,
                                                    CONCAT424(fStack_4c8,
                                                              CONCAT420(fStack_4cc,
                                                                        CONCAT416(fStack_4d0,
                                                                                  CONCAT412(
                                                  fStack_4d4,
                                                  CONCAT48(fStack_4d8,CONCAT44(fStack_4dc,local_4e0)
                                                          )))))));
                      auVar174 = ZEXT3264(local_5e0);
                      auVar117 = ZEXT3264(local_6e0);
                      ray = local_7a8;
                      context = local_7b0;
                      uVar78 = local_660._0_8_;
                      pre = local_768;
                    }
                    auVar143 = auVar135._0_32_;
                    auVar158 = auVar117._0_32_;
                    if (*local_6b0.valid != 0) break;
                  }
                  else {
                    (*pGVar15->occlusionFilterN)(&local_6b0);
                    uVar79 = (ulong)(uint)local_7a0._0_4_;
                    auVar135 = ZEXT3264(local_480);
                    auVar201 = ZEXT3264(local_640);
                    auVar213 = ZEXT3264(local_720);
                    auVar181 = ZEXT3264(CONCAT428(fStack_4c4,
                                                  CONCAT424(fStack_4c8,
                                                            CONCAT420(fStack_4cc,
                                                                      CONCAT416(fStack_4d0,
                                                                                CONCAT412(fStack_4d4
                                                                                          ,CONCAT48(
                                                  fStack_4d8,CONCAT44(fStack_4dc,local_4e0))))))));
                    auVar174 = ZEXT3264(local_5e0);
                    auVar117 = ZEXT3264(local_6e0);
                    ray = local_7a8;
                    context = local_7b0;
                    uVar78 = local_660._0_8_;
                    pre = local_768;
                    if (*local_6b0.valid != 0) goto LAB_016c66ab;
                  }
                  auVar143 = auVar135._0_32_;
                  auVar158 = auVar117._0_32_;
                  ray->tfar = (float)local_580._0_4_;
                  lVar81 = 0;
                  uVar78 = uVar78 ^ 1L << (local_680._0_8_ & 0x3f);
                  for (uVar77 = uVar78; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000
                      ) {
                    lVar81 = lVar81 + 1;
                  }
                  uVar79 = CONCAT71((int7)(uVar79 >> 8),uVar78 != 0);
                } while (uVar78 != 0);
              }
              local_640 = auVar201._0_32_;
              uVar79 = uVar79 & 0xffffffffffffff01;
              auVar162 = ZEXT3264(CONCAT428(fStack_524,
                                            CONCAT424(fStack_528,
                                                      CONCAT420(fStack_52c,
                                                                CONCAT416(fStack_530,
                                                                          CONCAT412(fStack_534,
                                                                                    CONCAT48(
                                                  fStack_538,CONCAT44(fStack_53c,local_540))))))));
              auVar168 = ZEXT3264(local_560);
              fVar119 = (float)local_760._0_4_;
            }
          }
        }
        auVar135 = ZEXT3264(local_600);
        auVar117 = ZEXT3264(local_620);
        auVar130 = ZEXT3264(auVar158);
        uStack_438 = uStack_438;
        uStack_430 = uStack_430;
        uStack_428 = uStack_428;
      }
LAB_016c628d:
      local_7a8 = ray;
      local_7b0 = context;
      local_768 = pre;
      if (8 < iVar14) {
        local_480 = auVar143;
        local_3e0._4_4_ = iVar14;
        local_3e0._0_4_ = iVar14;
        fStack_3d8 = (float)iVar14;
        fStack_3d4 = (float)iVar14;
        auStack_3d0._0_4_ = iVar14;
        auStack_3d0._4_4_ = iVar14;
        auStack_3d0._8_4_ = iVar14;
        auStack_3d0._12_4_ = iVar14;
        local_320._4_4_ = fVar119;
        local_320._0_4_ = fVar119;
        fStack_318 = fVar119;
        fStack_314 = fVar119;
        fStack_310 = fVar119;
        fStack_30c = fVar119;
        fStack_308 = fVar119;
        fStack_304 = fVar119;
        local_100 = local_700._0_4_;
        uStack_fc = local_700._0_4_;
        uStack_f8 = local_700._0_4_;
        uStack_f4 = local_700._0_4_;
        uStack_f0 = local_700._0_4_;
        uStack_ec = local_700._0_4_;
        uStack_e8 = local_700._0_4_;
        uStack_e4 = local_700._0_4_;
        local_120 = 1.0 / (float)local_3c0._0_4_;
        fStack_11c = local_120;
        fStack_118 = local_120;
        fStack_114 = local_120;
        fStack_110 = local_120;
        fStack_10c = local_120;
        fStack_108 = local_120;
        fStack_104 = local_120;
        lVar81 = 8;
        local_6e0 = auVar130._0_32_;
        do {
          auVar158 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar81 * 4 + lVar24);
          auVar125 = *(undefined1 (*) [32])(lVar24 + 0x22307f0 + lVar81 * 4);
          auVar11 = *(undefined1 (*) [32])(lVar24 + 0x2230c74 + lVar81 * 4);
          pauVar6 = (undefined1 (*) [28])(lVar24 + 0x22310f8 + lVar81 * 4);
          fVar103 = *(float *)*pauVar6;
          fVar200 = *(float *)(*pauVar6 + 4);
          fVar203 = *(float *)(*pauVar6 + 8);
          fVar204 = *(float *)(*pauVar6 + 0xc);
          fVar205 = *(float *)(*pauVar6 + 0x10);
          fVar206 = *(float *)(*pauVar6 + 0x14);
          fVar207 = *(float *)(*pauVar6 + 0x18);
          auVar74 = *pauVar6;
          auVar202._0_4_ = auVar162._0_4_ * fVar103;
          auVar202._4_4_ = auVar162._4_4_ * fVar200;
          auVar202._8_4_ = auVar162._8_4_ * fVar203;
          auVar202._12_4_ = auVar162._12_4_ * fVar204;
          auVar202._16_4_ = auVar162._16_4_ * fVar205;
          auVar202._20_4_ = auVar162._20_4_ * fVar206;
          auVar202._28_36_ = auVar201._28_36_;
          auVar202._24_4_ = auVar162._24_4_ * fVar207;
          fVar175 = auVar181._0_4_;
          auVar201._0_4_ = fVar175 * fVar103;
          fVar182 = auVar181._4_4_;
          auVar201._4_4_ = fVar182 * fVar200;
          fVar183 = auVar181._8_4_;
          auVar201._8_4_ = fVar183 * fVar203;
          fVar184 = auVar181._12_4_;
          auVar201._12_4_ = fVar184 * fVar204;
          fVar185 = auVar181._16_4_;
          auVar201._16_4_ = fVar185 * fVar205;
          fVar186 = auVar181._20_4_;
          auVar201._20_4_ = fVar186 * fVar206;
          auVar201._28_36_ = auVar130._28_36_;
          fVar187 = auVar181._24_4_;
          auVar201._24_4_ = fVar187 * fVar207;
          auVar23 = vfmadd231ps_fma(auVar202._0_32_,auVar11,auVar135._0_32_);
          auVar19 = vfmadd231ps_fma(auVar201._0_32_,auVar11,auVar174._0_32_);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar125,auVar168._0_32_);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar125,auVar117._0_32_);
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar158,auVar213._0_32_);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar158,local_3a0);
          auVar153 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar81 * 4 + lVar24);
          auVar90 = *(undefined1 (*) [32])(lVar24 + 0x2232c10 + lVar81 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar24 + 0x2233094 + lVar81 * 4);
          pfVar7 = (float *)(lVar24 + 0x2233518 + lVar81 * 4);
          fVar208 = *pfVar7;
          fVar195 = pfVar7[1];
          fVar199 = pfVar7[2];
          fVar214 = pfVar7[3];
          fVar215 = pfVar7[4];
          fVar216 = pfVar7[5];
          fVar217 = pfVar7[6];
          auVar169._0_4_ = auVar162._0_4_ * fVar208;
          auVar169._4_4_ = auVar162._4_4_ * fVar195;
          auVar169._8_4_ = auVar162._8_4_ * fVar199;
          auVar169._12_4_ = auVar162._12_4_ * fVar214;
          auVar169._16_4_ = auVar162._16_4_ * fVar215;
          auVar169._20_4_ = auVar162._20_4_ * fVar216;
          auVar169._28_36_ = auVar168._28_36_;
          auVar169._24_4_ = auVar162._24_4_ * fVar217;
          auVar163._0_4_ = fVar175 * fVar208;
          auVar163._4_4_ = fVar182 * fVar195;
          auVar163._8_4_ = fVar183 * fVar199;
          auVar163._12_4_ = fVar184 * fVar214;
          auVar163._16_4_ = fVar185 * fVar215;
          auVar163._20_4_ = fVar186 * fVar216;
          auVar163._28_36_ = auVar162._28_36_;
          auVar163._24_4_ = fVar187 * fVar217;
          auVar89 = vfmadd231ps_fma(auVar169._0_32_,auVar113,auVar135._0_32_);
          auVar20 = vfmadd231ps_fma(auVar163._0_32_,auVar113,auVar174._0_32_);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar90,auVar168._0_32_);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar90,auVar117._0_32_);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar153,auVar213._0_32_);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar153,local_3a0);
          auVar167 = ZEXT1632(auVar89);
          auVar143 = ZEXT1632(auVar23);
          auVar12 = vsubps_avx(auVar167,auVar143);
          auVar160 = ZEXT1632(auVar20);
          local_660 = ZEXT1632(auVar19);
          auVar18 = vsubps_avx(auVar160,local_660);
          auVar97._4_4_ = auVar12._4_4_ * auVar19._4_4_;
          auVar97._0_4_ = auVar12._0_4_ * auVar19._0_4_;
          auVar97._8_4_ = auVar12._8_4_ * auVar19._8_4_;
          auVar97._12_4_ = auVar12._12_4_ * auVar19._12_4_;
          auVar97._16_4_ = auVar12._16_4_ * 0.0;
          auVar97._20_4_ = auVar12._20_4_ * 0.0;
          auVar97._24_4_ = auVar12._24_4_ * 0.0;
          auVar97._28_4_ = auVar168._28_4_;
          fVar119 = auVar18._0_4_;
          auVar130._0_4_ = auVar23._0_4_ * fVar119;
          fVar118 = auVar18._4_4_;
          auVar130._4_4_ = auVar23._4_4_ * fVar118;
          fVar98 = auVar18._8_4_;
          auVar130._8_4_ = auVar23._8_4_ * fVar98;
          fVar99 = auVar18._12_4_;
          auVar130._12_4_ = auVar23._12_4_ * fVar99;
          fVar100 = auVar18._16_4_;
          auVar130._16_4_ = fVar100 * 0.0;
          fVar101 = auVar18._20_4_;
          auVar130._20_4_ = fVar101 * 0.0;
          fVar102 = auVar18._24_4_;
          auVar130._28_36_ = auVar117._28_36_;
          auVar130._24_4_ = fVar102 * 0.0;
          auVar97 = vsubps_avx(auVar97,auVar130._0_32_);
          auVar42._4_4_ = local_e0._4_4_ * fVar200;
          auVar42._0_4_ = (float)local_e0 * fVar103;
          auVar42._8_4_ = (float)uStack_d8 * fVar203;
          auVar42._12_4_ = uStack_d8._4_4_ * fVar204;
          auVar42._16_4_ = (float)uStack_d0 * fVar205;
          auVar42._20_4_ = uStack_d0._4_4_ * fVar206;
          auVar42._24_4_ = (float)uStack_c8 * fVar207;
          auVar42._28_4_ = auVar117._28_4_;
          auVar19 = vfmadd231ps_fma(auVar42,local_c0,auVar11);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_a0,auVar125);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_80,auVar158);
          auVar43._4_4_ = local_e0._4_4_ * fVar195;
          auVar43._0_4_ = (float)local_e0 * fVar208;
          auVar43._8_4_ = (float)uStack_d8 * fVar199;
          auVar43._12_4_ = uStack_d8._4_4_ * fVar214;
          auVar43._16_4_ = (float)uStack_d0 * fVar215;
          auVar43._20_4_ = uStack_d0._4_4_ * fVar216;
          auVar43._24_4_ = (float)uStack_c8 * fVar217;
          auVar43._28_4_ = uStack_c8._4_4_;
          auVar89 = vfmadd231ps_fma(auVar43,auVar113,local_c0);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar90,local_a0);
          auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar153,local_80);
          auVar201 = ZEXT1664(auVar89);
          auVar117._0_4_ = fVar119 * fVar119;
          auVar117._4_4_ = fVar118 * fVar118;
          auVar117._8_4_ = fVar98 * fVar98;
          auVar117._12_4_ = fVar99 * fVar99;
          auVar117._16_4_ = fVar100 * fVar100;
          auVar117._20_4_ = fVar101 * fVar101;
          auVar117._28_36_ = auVar181._28_36_;
          auVar117._24_4_ = fVar102 * fVar102;
          auVar21 = vfmadd231ps_fma(auVar117._0_32_,auVar12,auVar12);
          auVar115 = ZEXT1632(auVar19);
          local_700 = ZEXT1632(auVar89);
          auVar180 = vmaxps_avx(auVar115,local_700);
          auVar177._0_4_ = auVar180._0_4_ * auVar180._0_4_ * auVar21._0_4_;
          auVar177._4_4_ = auVar180._4_4_ * auVar180._4_4_ * auVar21._4_4_;
          auVar177._8_4_ = auVar180._8_4_ * auVar180._8_4_ * auVar21._8_4_;
          auVar177._12_4_ = auVar180._12_4_ * auVar180._12_4_ * auVar21._12_4_;
          auVar177._16_4_ = auVar180._16_4_ * auVar180._16_4_ * 0.0;
          auVar177._20_4_ = auVar180._20_4_ * auVar180._20_4_ * 0.0;
          auVar177._24_4_ = auVar180._24_4_ * auVar180._24_4_ * 0.0;
          auVar177._28_4_ = 0;
          auVar44._4_4_ = auVar97._4_4_ * auVar97._4_4_;
          auVar44._0_4_ = auVar97._0_4_ * auVar97._0_4_;
          auVar44._8_4_ = auVar97._8_4_ * auVar97._8_4_;
          auVar44._12_4_ = auVar97._12_4_ * auVar97._12_4_;
          auVar44._16_4_ = auVar97._16_4_ * auVar97._16_4_;
          auVar44._20_4_ = auVar97._20_4_ * auVar97._20_4_;
          auVar44._24_4_ = auVar97._24_4_ * auVar97._24_4_;
          auVar44._28_4_ = auVar97._28_4_;
          auVar180 = vcmpps_avx(auVar44,auVar177,2);
          local_260 = (int)lVar81;
          auVar178._4_4_ = local_260;
          auVar178._0_4_ = local_260;
          auVar178._8_4_ = local_260;
          auVar178._12_4_ = local_260;
          auVar178._16_4_ = local_260;
          auVar178._20_4_ = local_260;
          auVar178._24_4_ = local_260;
          auVar178._28_4_ = local_260;
          auVar97 = vpor_avx2(auVar178,_DAT_0205a920);
          auVar92 = vpcmpgtd_avx2(_local_3e0,auVar97);
          auVar97 = auVar92 & auVar180;
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0x7f,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0xbf,0) == '\0') &&
              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar97[0x1f]) {
            auVar117 = ZEXT3264(local_620);
            auVar135 = ZEXT3264(local_600);
            auVar174 = ZEXT3264(local_5e0);
            auVar162 = ZEXT3264(CONCAT428(fStack_524,
                                          CONCAT424(fStack_528,
                                                    CONCAT420(fStack_52c,
                                                              CONCAT416(fStack_530,
                                                                        CONCAT412(fStack_534,
                                                                                  CONCAT48(
                                                  fStack_538,CONCAT44(fStack_53c,local_540))))))));
            auVar181 = ZEXT3264(auVar181._0_32_);
            auVar168 = ZEXT3264(local_560);
            auVar213 = ZEXT3264(local_720);
            auVar130 = ZEXT3264(local_6e0);
            local_700 = auVar11;
          }
          else {
            _local_300 = vandps_avx(auVar92,auVar180);
            auVar45._4_4_ = local_440._4_4_ * fVar195;
            auVar45._0_4_ = (float)local_440 * fVar208;
            auVar45._8_4_ = (float)uStack_438 * fVar199;
            auVar45._12_4_ = uStack_438._4_4_ * fVar214;
            auVar45._16_4_ = (float)uStack_430 * fVar215;
            auVar45._20_4_ = uStack_430._4_4_ * fVar216;
            auVar45._24_4_ = (float)uStack_428 * fVar217;
            auVar45._28_4_ = auVar180._28_4_;
            auVar19 = vfmadd213ps_fma(auVar113,local_380,auVar45);
            auVar19 = vfmadd213ps_fma(auVar90,local_480,ZEXT1632(auVar19));
            auVar19 = vfmadd132ps_fma(auVar153,ZEXT1632(auVar19),local_640);
            local_400 = ZEXT1632(auVar19);
            local_520._0_4_ = auVar74._0_4_;
            local_520._4_4_ = auVar74._4_4_;
            uStack_518._0_4_ = auVar74._8_4_;
            uStack_518._4_4_ = auVar74._12_4_;
            auStack_510._0_4_ = auVar74._16_4_;
            auStack_510._4_4_ = auVar74._20_4_;
            fStack_508 = auVar74._24_4_;
            auVar46._4_4_ = local_440._4_4_ * (float)local_520._4_4_;
            auVar46._0_4_ = (float)local_440 * (float)local_520._0_4_;
            auVar46._8_4_ = (float)uStack_438 * (float)uStack_518;
            auVar46._12_4_ = uStack_438._4_4_ * uStack_518._4_4_;
            auVar46._16_4_ = (float)uStack_430 * (float)auStack_510._0_4_;
            auVar46._20_4_ = uStack_430._4_4_ * (float)auStack_510._4_4_;
            auVar46._24_4_ = (float)uStack_428 * fStack_508;
            auVar46._28_4_ = auVar180._28_4_;
            auVar19 = vfmadd213ps_fma(auVar11,local_380,auVar46);
            auVar19 = vfmadd213ps_fma(auVar125,local_480,ZEXT1632(auVar19));
            auVar125 = *(undefined1 (*) [32])(lVar24 + 0x223157c + lVar81 * 4);
            auVar11 = *(undefined1 (*) [32])(lVar24 + 0x2231a00 + lVar81 * 4);
            auVar153 = *(undefined1 (*) [32])(lVar24 + 0x2231e84 + lVar81 * 4);
            pfVar7 = (float *)(lVar24 + 0x2232308 + lVar81 * 4);
            fVar119 = *pfVar7;
            fVar118 = pfVar7[1];
            fVar98 = pfVar7[2];
            fVar99 = pfVar7[3];
            fVar100 = pfVar7[4];
            fVar101 = pfVar7[5];
            fVar102 = pfVar7[6];
            auVar47._4_4_ = fStack_53c * fVar118;
            auVar47._0_4_ = local_540 * fVar119;
            auVar47._8_4_ = fStack_538 * fVar98;
            auVar47._12_4_ = fStack_534 * fVar99;
            auVar47._16_4_ = fStack_530 * fVar100;
            auVar47._20_4_ = fStack_52c * fVar101;
            auVar47._24_4_ = fStack_528 * fVar102;
            auVar47._28_4_ = auVar12._28_4_;
            auVar197._0_4_ = fVar119 * fVar175;
            auVar197._4_4_ = fVar118 * fVar182;
            auVar197._8_4_ = fVar98 * fVar183;
            auVar197._12_4_ = fVar99 * fVar184;
            auVar197._16_4_ = fVar100 * fVar185;
            auVar197._20_4_ = fVar101 * fVar186;
            auVar197._24_4_ = fVar102 * fVar187;
            auVar197._28_4_ = 0;
            auVar48._4_4_ = fVar118 * local_440._4_4_;
            auVar48._0_4_ = fVar119 * (float)local_440;
            auVar48._8_4_ = fVar98 * (float)uStack_438;
            auVar48._12_4_ = fVar99 * uStack_438._4_4_;
            auVar48._16_4_ = fVar100 * (float)uStack_430;
            auVar48._20_4_ = fVar101 * uStack_430._4_4_;
            auVar48._24_4_ = fVar102 * (float)uStack_428;
            auVar48._28_4_ = pfVar7[7];
            auVar21 = vfmadd231ps_fma(auVar47,auVar153,local_600);
            auVar22 = vfmadd231ps_fma(auVar197,auVar153,local_5e0);
            auVar87 = vfmadd231ps_fma(auVar48,local_380,auVar153);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar11,local_560);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar11,local_620);
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_480,auVar11);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar125,local_720);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar125,local_3a0);
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar125,local_640);
            pfVar7 = (float *)(lVar24 + 0x2234728 + lVar81 * 4);
            fVar119 = *pfVar7;
            fVar118 = pfVar7[1];
            fVar98 = pfVar7[2];
            fVar99 = pfVar7[3];
            fVar100 = pfVar7[4];
            fVar101 = pfVar7[5];
            fVar102 = pfVar7[6];
            local_3c0 = auVar18;
            auVar49._4_4_ = fStack_53c * fVar118;
            auVar49._0_4_ = local_540 * fVar119;
            auVar49._8_4_ = fStack_538 * fVar98;
            auVar49._12_4_ = fStack_534 * fVar99;
            auVar49._16_4_ = fStack_530 * fVar100;
            auVar49._20_4_ = fStack_52c * fVar101;
            auVar49._24_4_ = fStack_528 * fVar102;
            auVar49._28_4_ = auVar18._28_4_;
            auVar50._4_4_ = fVar182 * fVar118;
            auVar50._0_4_ = fVar175 * fVar119;
            auVar50._8_4_ = fVar183 * fVar98;
            auVar50._12_4_ = fVar184 * fVar99;
            auVar50._16_4_ = fVar185 * fVar100;
            auVar50._20_4_ = fVar186 * fVar101;
            auVar50._24_4_ = fVar187 * fVar102;
            auVar50._28_4_ = fStack_524;
            auVar51._4_4_ = local_440._4_4_ * fVar118;
            auVar51._0_4_ = (float)local_440 * fVar119;
            auVar51._8_4_ = (float)uStack_438 * fVar98;
            auVar51._12_4_ = uStack_438._4_4_ * fVar99;
            auVar51._16_4_ = (float)uStack_430 * fVar100;
            auVar51._20_4_ = uStack_430._4_4_ * fVar101;
            auVar51._24_4_ = (float)uStack_428 * fVar102;
            auVar51._28_4_ = pfVar7[7];
            auVar125 = *(undefined1 (*) [32])(lVar24 + 0x22342a4 + lVar81 * 4);
            auVar86 = vfmadd231ps_fma(auVar49,auVar125,local_600);
            auVar120 = vfmadd231ps_fma(auVar50,auVar125,local_5e0);
            auVar106 = vfmadd231ps_fma(auVar51,local_380,auVar125);
            auVar125 = *(undefined1 (*) [32])(lVar24 + 0x2233e20 + lVar81 * 4);
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar125,local_560);
            auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar125,local_620);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar125,local_480);
            auVar125 = *(undefined1 (*) [32])(lVar24 + 0x223399c + lVar81 * 4);
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar125,local_720);
            auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar125,local_3a0);
            auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),local_640,auVar125);
            auVar179._8_4_ = 0x7fffffff;
            auVar179._0_8_ = 0x7fffffff7fffffff;
            auVar179._12_4_ = 0x7fffffff;
            auVar179._16_4_ = 0x7fffffff;
            auVar179._20_4_ = 0x7fffffff;
            auVar179._24_4_ = 0x7fffffff;
            auVar179._28_4_ = 0x7fffffff;
            auVar125 = vandps_avx(ZEXT1632(auVar21),auVar179);
            auVar11 = vandps_avx(ZEXT1632(auVar22),auVar179);
            auVar11 = vmaxps_avx(auVar125,auVar11);
            auVar125 = vandps_avx(ZEXT1632(auVar87),auVar179);
            auVar125 = vmaxps_avx(auVar11,auVar125);
            auVar125 = vcmpps_avx(auVar125,_local_320,1);
            auVar153 = vblendvps_avx(ZEXT1632(auVar21),auVar12,auVar125);
            auVar90 = vblendvps_avx(ZEXT1632(auVar22),auVar18,auVar125);
            auVar125 = vandps_avx(ZEXT1632(auVar86),auVar179);
            auVar11 = vandps_avx(ZEXT1632(auVar120),auVar179);
            auVar11 = vmaxps_avx(auVar125,auVar11);
            auVar125 = vandps_avx(auVar179,ZEXT1632(auVar106));
            auVar125 = vmaxps_avx(auVar11,auVar125);
            auVar11 = vcmpps_avx(auVar125,_local_320,1);
            auVar125 = vblendvps_avx(ZEXT1632(auVar86),auVar12,auVar11);
            auVar11 = vblendvps_avx(ZEXT1632(auVar120),auVar18,auVar11);
            auVar19 = vfmadd213ps_fma(auVar158,local_640,ZEXT1632(auVar19));
            auVar21 = vfmadd213ps_fma(auVar153,auVar153,ZEXT832(0) << 0x20);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar90,auVar90);
            auVar113 = vrsqrtps_avx(ZEXT1632(auVar21));
            fVar119 = auVar113._0_4_;
            fVar118 = auVar113._4_4_;
            fVar98 = auVar113._8_4_;
            fVar99 = auVar113._12_4_;
            fVar100 = auVar113._16_4_;
            fVar101 = auVar113._20_4_;
            fVar102 = auVar113._24_4_;
            auVar52._4_4_ = fVar118 * fVar118 * fVar118 * auVar21._4_4_ * -0.5;
            auVar52._0_4_ = fVar119 * fVar119 * fVar119 * auVar21._0_4_ * -0.5;
            auVar52._8_4_ = fVar98 * fVar98 * fVar98 * auVar21._8_4_ * -0.5;
            auVar52._12_4_ = fVar99 * fVar99 * fVar99 * auVar21._12_4_ * -0.5;
            auVar52._16_4_ = fVar100 * fVar100 * fVar100 * -0.0;
            auVar52._20_4_ = fVar101 * fVar101 * fVar101 * -0.0;
            auVar52._24_4_ = fVar102 * fVar102 * fVar102 * -0.0;
            auVar52._28_4_ = 0;
            auVar212._8_4_ = 0x3fc00000;
            auVar212._0_8_ = 0x3fc000003fc00000;
            auVar212._12_4_ = 0x3fc00000;
            auVar212._16_4_ = 0x3fc00000;
            auVar212._20_4_ = 0x3fc00000;
            auVar212._24_4_ = 0x3fc00000;
            auVar212._28_4_ = 0x3fc00000;
            auVar21 = vfmadd231ps_fma(auVar52,auVar212,auVar113);
            fVar119 = auVar21._0_4_;
            fVar118 = auVar21._4_4_;
            auVar53._4_4_ = auVar90._4_4_ * fVar118;
            auVar53._0_4_ = auVar90._0_4_ * fVar119;
            fVar98 = auVar21._8_4_;
            auVar53._8_4_ = auVar90._8_4_ * fVar98;
            fVar99 = auVar21._12_4_;
            auVar53._12_4_ = auVar90._12_4_ * fVar99;
            auVar53._16_4_ = auVar90._16_4_ * 0.0;
            auVar53._20_4_ = auVar90._20_4_ * 0.0;
            auVar53._24_4_ = auVar90._24_4_ * 0.0;
            auVar53._28_4_ = auVar113._28_4_;
            auVar54._4_4_ = fVar118 * -auVar153._4_4_;
            auVar54._0_4_ = fVar119 * -auVar153._0_4_;
            auVar54._8_4_ = fVar98 * -auVar153._8_4_;
            auVar54._12_4_ = fVar99 * -auVar153._12_4_;
            auVar54._16_4_ = -auVar153._16_4_ * 0.0;
            auVar54._20_4_ = -auVar153._20_4_ * 0.0;
            auVar54._24_4_ = -auVar153._24_4_ * 0.0;
            auVar54._28_4_ = auVar90._28_4_;
            auVar21 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar11,auVar11);
            auVar153 = vrsqrtps_avx(ZEXT1632(auVar21));
            auVar55._28_4_ = local_620._28_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar99 * 0.0,
                                    CONCAT48(fVar98 * 0.0,CONCAT44(fVar118 * 0.0,fVar119 * 0.0))));
            fVar119 = auVar153._0_4_;
            fVar118 = auVar153._4_4_;
            fVar98 = auVar153._8_4_;
            fVar99 = auVar153._12_4_;
            fVar100 = auVar153._16_4_;
            fVar101 = auVar153._20_4_;
            fVar102 = auVar153._24_4_;
            auVar56._4_4_ = fVar118 * fVar118 * fVar118 * auVar21._4_4_ * -0.5;
            auVar56._0_4_ = fVar119 * fVar119 * fVar119 * auVar21._0_4_ * -0.5;
            auVar56._8_4_ = fVar98 * fVar98 * fVar98 * auVar21._8_4_ * -0.5;
            auVar56._12_4_ = fVar99 * fVar99 * fVar99 * auVar21._12_4_ * -0.5;
            auVar56._16_4_ = fVar100 * fVar100 * fVar100 * -0.0;
            auVar56._20_4_ = fVar101 * fVar101 * fVar101 * -0.0;
            auVar56._24_4_ = fVar102 * fVar102 * fVar102 * -0.0;
            auVar56._28_4_ = 0;
            auVar21 = vfmadd231ps_fma(auVar56,auVar212,auVar153);
            fVar119 = auVar21._0_4_;
            fVar118 = auVar21._4_4_;
            auVar57._4_4_ = auVar11._4_4_ * fVar118;
            auVar57._0_4_ = auVar11._0_4_ * fVar119;
            fVar98 = auVar21._8_4_;
            auVar57._8_4_ = auVar11._8_4_ * fVar98;
            fVar99 = auVar21._12_4_;
            auVar57._12_4_ = auVar11._12_4_ * fVar99;
            auVar57._16_4_ = auVar11._16_4_ * 0.0;
            auVar57._20_4_ = auVar11._20_4_ * 0.0;
            auVar57._24_4_ = auVar11._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar58._4_4_ = fVar118 * -auVar125._4_4_;
            auVar58._0_4_ = fVar119 * -auVar125._0_4_;
            auVar58._8_4_ = fVar98 * -auVar125._8_4_;
            auVar58._12_4_ = fVar99 * -auVar125._12_4_;
            auVar58._16_4_ = -auVar125._16_4_ * 0.0;
            auVar58._20_4_ = -auVar125._20_4_ * 0.0;
            auVar58._24_4_ = -auVar125._24_4_ * 0.0;
            auVar58._28_4_ = auVar153._28_4_;
            auVar59._28_4_ = 0xbf000000;
            auVar59._0_28_ =
                 ZEXT1628(CONCAT412(fVar99 * 0.0,
                                    CONCAT48(fVar98 * 0.0,CONCAT44(fVar118 * 0.0,fVar119 * 0.0))));
            auVar21 = vfmadd213ps_fma(auVar53,auVar115,auVar143);
            auVar22 = vfmadd213ps_fma(auVar54,auVar115,local_660);
            auVar87 = vfmadd213ps_fma(auVar55,auVar115,ZEXT1632(auVar19));
            auVar107 = vfnmadd213ps_fma(auVar53,auVar115,auVar143);
            auVar86 = vfmadd213ps_fma(auVar57,local_700,auVar167);
            auVar131 = vfnmadd213ps_fma(auVar54,auVar115,local_660);
            auVar120 = vfmadd213ps_fma(auVar58,local_700,auVar160);
            auVar19 = vfnmadd231ps_fma(ZEXT1632(auVar19),auVar115,auVar55);
            auVar106 = vfmadd213ps_fma(auVar59,local_700,local_400);
            auVar137 = vfnmadd213ps_fma(auVar57,local_700,auVar167);
            auVar84 = vfnmadd213ps_fma(auVar58,local_700,auVar160);
            auVar105 = vfnmadd231ps_fma(local_400,local_700,auVar59);
            auVar125 = vsubps_avx(ZEXT1632(auVar120),ZEXT1632(auVar131));
            auVar11 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar19));
            auVar60._4_4_ = auVar125._4_4_ * auVar19._4_4_;
            auVar60._0_4_ = auVar125._0_4_ * auVar19._0_4_;
            auVar60._8_4_ = auVar125._8_4_ * auVar19._8_4_;
            auVar60._12_4_ = auVar125._12_4_ * auVar19._12_4_;
            auVar60._16_4_ = auVar125._16_4_ * 0.0;
            auVar60._20_4_ = auVar125._20_4_ * 0.0;
            auVar60._24_4_ = auVar125._24_4_ * 0.0;
            auVar60._28_4_ = 0;
            auVar85 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar131),auVar11);
            auVar61._4_4_ = auVar107._4_4_ * auVar11._4_4_;
            auVar61._0_4_ = auVar107._0_4_ * auVar11._0_4_;
            auVar61._8_4_ = auVar107._8_4_ * auVar11._8_4_;
            auVar61._12_4_ = auVar107._12_4_ * auVar11._12_4_;
            auVar61._16_4_ = auVar11._16_4_ * 0.0;
            auVar61._20_4_ = auVar11._20_4_ * 0.0;
            auVar61._24_4_ = auVar11._24_4_ * 0.0;
            auVar61._28_4_ = auVar11._28_4_;
            auVar180 = ZEXT1632(auVar107);
            auVar11 = vsubps_avx(ZEXT1632(auVar86),auVar180);
            auVar97 = ZEXT1632(auVar19);
            auVar19 = vfmsub231ps_fma(auVar61,auVar97,auVar11);
            auVar62._4_4_ = auVar131._4_4_ * auVar11._4_4_;
            auVar62._0_4_ = auVar131._0_4_ * auVar11._0_4_;
            auVar62._8_4_ = auVar131._8_4_ * auVar11._8_4_;
            auVar62._12_4_ = auVar131._12_4_ * auVar11._12_4_;
            auVar62._16_4_ = auVar11._16_4_ * 0.0;
            auVar62._20_4_ = auVar11._20_4_ * 0.0;
            auVar62._24_4_ = auVar11._24_4_ * 0.0;
            auVar62._28_4_ = auVar11._28_4_;
            auVar107 = vfmsub231ps_fma(auVar62,auVar180,auVar125);
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
            auStack_750 = auVar158._16_16_;
            local_760 = local_300._16_16_;
            auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar85));
            auVar92 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,2);
            auVar158 = vblendvps_avx(ZEXT1632(auVar137),ZEXT1632(auVar21),auVar92);
            auVar125 = vblendvps_avx(ZEXT1632(auVar84),ZEXT1632(auVar22),auVar92);
            auVar11 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar87),auVar92);
            auVar153 = vblendvps_avx(auVar180,ZEXT1632(auVar86),auVar92);
            auVar90 = vblendvps_avx(ZEXT1632(auVar131),ZEXT1632(auVar120),auVar92);
            auVar113 = vblendvps_avx(auVar97,ZEXT1632(auVar106),auVar92);
            auVar180 = vblendvps_avx(ZEXT1632(auVar86),auVar180,auVar92);
            auVar18 = vblendvps_avx(ZEXT1632(auVar120),ZEXT1632(auVar131),auVar92);
            auVar19 = vpackssdw_avx(local_300._0_16_,local_300._16_16_);
            auVar97 = vblendvps_avx(ZEXT1632(auVar106),auVar97,auVar92);
            auVar180 = vsubps_avx(auVar180,auVar158);
            auVar18 = vsubps_avx(auVar18,auVar125);
            auVar160 = vsubps_avx(auVar97,auVar11);
            auVar167 = vsubps_avx(auVar158,auVar153);
            auVar143 = vsubps_avx(auVar125,auVar90);
            auVar109 = vsubps_avx(auVar11,auVar113);
            auVar201 = ZEXT3264(auVar109);
            auVar150._0_4_ = auVar160._0_4_ * auVar158._0_4_;
            auVar150._4_4_ = auVar160._4_4_ * auVar158._4_4_;
            auVar150._8_4_ = auVar160._8_4_ * auVar158._8_4_;
            auVar150._12_4_ = auVar160._12_4_ * auVar158._12_4_;
            auVar150._16_4_ = auVar160._16_4_ * auVar158._16_4_;
            auVar150._20_4_ = auVar160._20_4_ * auVar158._20_4_;
            auVar150._24_4_ = auVar160._24_4_ * auVar158._24_4_;
            auVar150._28_4_ = 0;
            auVar21 = vfmsub231ps_fma(auVar150,auVar11,auVar180);
            auVar63._4_4_ = auVar180._4_4_ * auVar125._4_4_;
            auVar63._0_4_ = auVar180._0_4_ * auVar125._0_4_;
            auVar63._8_4_ = auVar180._8_4_ * auVar125._8_4_;
            auVar63._12_4_ = auVar180._12_4_ * auVar125._12_4_;
            auVar63._16_4_ = auVar180._16_4_ * auVar125._16_4_;
            auVar63._20_4_ = auVar180._20_4_ * auVar125._20_4_;
            auVar63._24_4_ = auVar180._24_4_ * auVar125._24_4_;
            auVar63._28_4_ = auVar97._28_4_;
            auVar22 = vfmsub231ps_fma(auVar63,auVar158,auVar18);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar21),_DAT_02020f00);
            auVar151._0_4_ = auVar18._0_4_ * auVar11._0_4_;
            auVar151._4_4_ = auVar18._4_4_ * auVar11._4_4_;
            auVar151._8_4_ = auVar18._8_4_ * auVar11._8_4_;
            auVar151._12_4_ = auVar18._12_4_ * auVar11._12_4_;
            auVar151._16_4_ = auVar18._16_4_ * auVar11._16_4_;
            auVar151._20_4_ = auVar18._20_4_ * auVar11._20_4_;
            auVar151._24_4_ = auVar18._24_4_ * auVar11._24_4_;
            auVar151._28_4_ = 0;
            auVar22 = vfmsub231ps_fma(auVar151,auVar125,auVar160);
            auVar22 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar22));
            auVar152._0_4_ = auVar109._0_4_ * auVar153._0_4_;
            auVar152._4_4_ = auVar109._4_4_ * auVar153._4_4_;
            auVar152._8_4_ = auVar109._8_4_ * auVar153._8_4_;
            auVar152._12_4_ = auVar109._12_4_ * auVar153._12_4_;
            auVar152._16_4_ = auVar109._16_4_ * auVar153._16_4_;
            auVar152._20_4_ = auVar109._20_4_ * auVar153._20_4_;
            auVar152._24_4_ = auVar109._24_4_ * auVar153._24_4_;
            auVar152._28_4_ = 0;
            auVar21 = vfmsub231ps_fma(auVar152,auVar167,auVar113);
            auVar64._4_4_ = auVar143._4_4_ * auVar113._4_4_;
            auVar64._0_4_ = auVar143._0_4_ * auVar113._0_4_;
            auVar64._8_4_ = auVar143._8_4_ * auVar113._8_4_;
            auVar64._12_4_ = auVar143._12_4_ * auVar113._12_4_;
            auVar64._16_4_ = auVar143._16_4_ * auVar113._16_4_;
            auVar64._20_4_ = auVar143._20_4_ * auVar113._20_4_;
            auVar64._24_4_ = auVar143._24_4_ * auVar113._24_4_;
            auVar64._28_4_ = auVar113._28_4_;
            auVar87 = vfmsub231ps_fma(auVar64,auVar90,auVar109);
            auVar65._4_4_ = auVar167._4_4_ * auVar90._4_4_;
            auVar65._0_4_ = auVar167._0_4_ * auVar90._0_4_;
            auVar65._8_4_ = auVar167._8_4_ * auVar90._8_4_;
            auVar65._12_4_ = auVar167._12_4_ * auVar90._12_4_;
            auVar65._16_4_ = auVar167._16_4_ * auVar90._16_4_;
            auVar65._20_4_ = auVar167._20_4_ * auVar90._20_4_;
            auVar65._24_4_ = auVar167._24_4_ * auVar90._24_4_;
            auVar65._28_4_ = auVar90._28_4_;
            auVar86 = vfmsub231ps_fma(auVar65,auVar143,auVar153);
            auVar21 = vfmadd231ps_fma(ZEXT1632(auVar86),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
            auVar87 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar87));
            auVar153 = vmaxps_avx(ZEXT1632(auVar22),ZEXT1632(auVar87));
            auVar153 = vcmpps_avx(auVar153,ZEXT832(0) << 0x20,2);
            auVar21 = vpackssdw_avx(auVar153._0_16_,auVar153._16_16_);
            auVar19 = vpand_avx(auVar19,auVar21);
            auVar153 = vpmovsxwd_avx2(auVar19);
            if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar153 >> 0x7f,0) == '\0') &&
                  (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar153 >> 0xbf,0) == '\0') &&
                (auVar153 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar153[0x1f]) {
LAB_016c7548:
              auVar134._8_8_ = uStack_458;
              auVar134._0_8_ = local_460;
              auVar134._16_8_ = uStack_450;
              auVar134._24_8_ = uStack_448;
            }
            else {
              auVar66._4_4_ = auVar18._4_4_ * auVar109._4_4_;
              auVar66._0_4_ = auVar18._0_4_ * auVar109._0_4_;
              auVar66._8_4_ = auVar18._8_4_ * auVar109._8_4_;
              auVar66._12_4_ = auVar18._12_4_ * auVar109._12_4_;
              auVar66._16_4_ = auVar18._16_4_ * auVar109._16_4_;
              auVar66._20_4_ = auVar18._20_4_ * auVar109._20_4_;
              auVar66._24_4_ = auVar18._24_4_ * auVar109._24_4_;
              auVar66._28_4_ = auVar153._28_4_;
              auVar106 = vfmsub231ps_fma(auVar66,auVar143,auVar160);
              auVar161._0_4_ = auVar160._0_4_ * auVar167._0_4_;
              auVar161._4_4_ = auVar160._4_4_ * auVar167._4_4_;
              auVar161._8_4_ = auVar160._8_4_ * auVar167._8_4_;
              auVar161._12_4_ = auVar160._12_4_ * auVar167._12_4_;
              auVar161._16_4_ = auVar160._16_4_ * auVar167._16_4_;
              auVar161._20_4_ = auVar160._20_4_ * auVar167._20_4_;
              auVar161._24_4_ = auVar160._24_4_ * auVar167._24_4_;
              auVar161._28_4_ = 0;
              auVar120 = vfmsub231ps_fma(auVar161,auVar180,auVar109);
              auVar67._4_4_ = auVar180._4_4_ * auVar143._4_4_;
              auVar67._0_4_ = auVar180._0_4_ * auVar143._0_4_;
              auVar67._8_4_ = auVar180._8_4_ * auVar143._8_4_;
              auVar67._12_4_ = auVar180._12_4_ * auVar143._12_4_;
              auVar67._16_4_ = auVar180._16_4_ * auVar143._16_4_;
              auVar67._20_4_ = auVar180._20_4_ * auVar143._20_4_;
              auVar67._24_4_ = auVar180._24_4_ * auVar143._24_4_;
              auVar67._28_4_ = auVar143._28_4_;
              auVar85 = vfmsub231ps_fma(auVar67,auVar167,auVar18);
              auVar21 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar120),ZEXT1632(auVar85));
              auVar201 = ZEXT864(0) << 0x20;
              auVar86 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT1632(auVar106),ZEXT832(0) << 0x20);
              auVar153 = vrcpps_avx(ZEXT1632(auVar86));
              auVar198._8_4_ = 0x3f800000;
              auVar198._0_8_ = &DAT_3f8000003f800000;
              auVar198._12_4_ = 0x3f800000;
              auVar198._16_4_ = 0x3f800000;
              auVar198._20_4_ = 0x3f800000;
              auVar198._24_4_ = 0x3f800000;
              auVar198._28_4_ = 0x3f800000;
              auVar21 = vfnmadd213ps_fma(auVar153,ZEXT1632(auVar86),auVar198);
              auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar153,auVar153);
              auVar132._0_4_ = auVar85._0_4_ * auVar11._0_4_;
              auVar132._4_4_ = auVar85._4_4_ * auVar11._4_4_;
              auVar132._8_4_ = auVar85._8_4_ * auVar11._8_4_;
              auVar132._12_4_ = auVar85._12_4_ * auVar11._12_4_;
              auVar132._16_4_ = auVar11._16_4_ * 0.0;
              auVar132._20_4_ = auVar11._20_4_ * 0.0;
              auVar132._24_4_ = auVar11._24_4_ * 0.0;
              auVar132._28_4_ = 0;
              auVar120 = vfmadd231ps_fma(auVar132,ZEXT1632(auVar120),auVar125);
              auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar158,ZEXT1632(auVar106));
              fVar118 = auVar21._0_4_;
              fVar98 = auVar21._4_4_;
              fVar99 = auVar21._8_4_;
              fVar100 = auVar21._12_4_;
              auVar153 = ZEXT1632(CONCAT412(fVar100 * auVar120._12_4_,
                                            CONCAT48(fVar99 * auVar120._8_4_,
                                                     CONCAT44(fVar98 * auVar120._4_4_,
                                                              fVar118 * auVar120._0_4_))));
              fVar119 = local_7a8->tfar;
              auVar133._4_4_ = fVar119;
              auVar133._0_4_ = fVar119;
              auVar133._8_4_ = fVar119;
              auVar133._12_4_ = fVar119;
              auVar133._16_4_ = fVar119;
              auVar133._20_4_ = fVar119;
              auVar133._24_4_ = fVar119;
              auVar133._28_4_ = fVar119;
              auVar73._4_4_ = uStack_fc;
              auVar73._0_4_ = local_100;
              auVar73._8_4_ = uStack_f8;
              auVar73._12_4_ = uStack_f4;
              auVar73._16_4_ = uStack_f0;
              auVar73._20_4_ = uStack_ec;
              auVar73._24_4_ = uStack_e8;
              auVar73._28_4_ = uStack_e4;
              auVar158 = vcmpps_avx(auVar73,auVar153,2);
              auVar11 = vcmpps_avx(auVar153,auVar133,2);
              auVar158 = vandps_avx(auVar11,auVar158);
              auVar21 = vpackssdw_avx(auVar158._0_16_,auVar158._16_16_);
              auVar19 = vpand_avx(auVar19,auVar21);
              auVar158 = vpmovsxwd_avx2(auVar19);
              if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar158 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar158 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar158 >> 0x7f,0) == '\0') &&
                    (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar158 >> 0xbf,0) == '\0') &&
                  (auVar158 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar158[0x1f]) goto LAB_016c7548;
              auVar158 = vcmpps_avx(ZEXT1632(auVar86),ZEXT832(0) << 0x20,4);
              auVar21 = vpackssdw_avx(auVar158._0_16_,auVar158._16_16_);
              auVar19 = vpand_avx(auVar19,auVar21);
              auVar158 = vpmovsxwd_avx2(auVar19);
              auVar134._8_8_ = uStack_458;
              auVar134._0_8_ = local_460;
              auVar134._16_8_ = uStack_450;
              auVar134._24_8_ = uStack_448;
              if ((((((((auVar158 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar158 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar158 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar158 >> 0x7f,0) != '\0') ||
                    (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar158 >> 0xbf,0) != '\0') ||
                  (auVar158 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar158[0x1f] < '\0') {
                auVar90 = ZEXT1632(CONCAT412(fVar100 * auVar22._12_4_,
                                             CONCAT48(fVar99 * auVar22._8_4_,
                                                      CONCAT44(fVar98 * auVar22._4_4_,
                                                               fVar118 * auVar22._0_4_))));
                auVar68._28_4_ = SUB84(uStack_448,4);
                auVar68._0_28_ =
                     ZEXT1628(CONCAT412(fVar100 * auVar87._12_4_,
                                        CONCAT48(fVar99 * auVar87._8_4_,
                                                 CONCAT44(fVar98 * auVar87._4_4_,
                                                          fVar118 * auVar87._0_4_))));
                auVar173._8_4_ = 0x3f800000;
                auVar173._0_8_ = &DAT_3f8000003f800000;
                auVar173._12_4_ = 0x3f800000;
                auVar173._16_4_ = 0x3f800000;
                auVar173._20_4_ = 0x3f800000;
                auVar173._24_4_ = 0x3f800000;
                auVar173._28_4_ = 0x3f800000;
                auVar11 = vsubps_avx(auVar173,auVar90);
                _local_160 = vblendvps_avx(auVar11,auVar90,auVar92);
                auVar11 = vsubps_avx(auVar173,auVar68);
                local_360 = vblendvps_avx(auVar11,auVar68,auVar92);
                local_180 = auVar153;
                auVar134 = auVar158;
              }
            }
            auVar213 = ZEXT3264(local_720);
            auVar72._4_4_ = fStack_4dc;
            auVar72._0_4_ = local_4e0;
            auVar72._8_4_ = fStack_4d8;
            auVar72._12_4_ = fStack_4d4;
            auVar72._16_4_ = fStack_4d0;
            auVar72._20_4_ = fStack_4cc;
            auVar72._24_4_ = fStack_4c8;
            auVar72._28_4_ = fStack_4c4;
            if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar134 >> 0x7f,0) == '\0') &&
                  (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar134 >> 0xbf,0) == '\0') &&
                (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar134[0x1f]) {
              auVar117 = ZEXT3264(local_620);
              auVar135 = ZEXT3264(local_600);
              auVar162 = ZEXT3264(CONCAT428(fStack_524,
                                            CONCAT424(fStack_528,
                                                      CONCAT420(fStack_52c,
                                                                CONCAT416(fStack_530,
                                                                          CONCAT412(fStack_534,
                                                                                    CONCAT48(
                                                  fStack_538,CONCAT44(fStack_53c,local_540))))))));
              auVar168 = ZEXT3264(local_560);
              auVar174 = ZEXT3264(local_5e0);
              auVar181 = ZEXT3264(auVar72);
              auVar130 = ZEXT3264(local_6e0);
            }
            else {
              auVar158 = vsubps_avx(local_700,auVar115);
              auVar19 = vfmadd213ps_fma(auVar158,_local_160,auVar115);
              fVar119 = local_768->depth_scale;
              auVar69._4_4_ = (auVar19._4_4_ + auVar19._4_4_) * fVar119;
              auVar69._0_4_ = (auVar19._0_4_ + auVar19._0_4_) * fVar119;
              auVar69._8_4_ = (auVar19._8_4_ + auVar19._8_4_) * fVar119;
              auVar69._12_4_ = (auVar19._12_4_ + auVar19._12_4_) * fVar119;
              auVar69._16_4_ = fVar119 * 0.0;
              auVar69._20_4_ = fVar119 * 0.0;
              auVar69._24_4_ = fVar119 * 0.0;
              auVar69._28_4_ = fVar119;
              auVar158 = vcmpps_avx(local_180,auVar69,6);
              auVar11 = auVar134 & auVar158;
              auVar162 = ZEXT3264(CONCAT428(fStack_524,
                                            CONCAT424(fStack_528,
                                                      CONCAT420(fStack_52c,
                                                                CONCAT416(fStack_530,
                                                                          CONCAT412(fStack_534,
                                                                                    CONCAT48(
                                                  fStack_538,CONCAT44(fStack_53c,local_540))))))));
              auVar168 = ZEXT3264(local_560);
              auVar174 = ZEXT3264(local_5e0);
              if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar11 >> 0x7f,0) == '\0') &&
                    (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar11 >> 0xbf,0) == '\0') &&
                  (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar11[0x1f]) {
                auVar130 = ZEXT3264(local_6e0);
                auVar117 = ZEXT3264(local_620);
                auVar135 = ZEXT3264(local_600);
                auVar181 = ZEXT3264(auVar72);
              }
              else {
                local_200 = vandps_avx(auVar158,auVar134);
                auVar116._8_4_ = 0xbf800000;
                auVar116._0_8_ = 0xbf800000bf800000;
                auVar116._12_4_ = 0xbf800000;
                auVar116._16_4_ = 0xbf800000;
                auVar116._20_4_ = 0xbf800000;
                auVar116._24_4_ = 0xbf800000;
                auVar116._28_4_ = 0xbf800000;
                auVar129._8_4_ = 0x40000000;
                auVar129._0_8_ = 0x4000000040000000;
                auVar129._12_4_ = 0x40000000;
                auVar129._16_4_ = 0x40000000;
                auVar129._20_4_ = 0x40000000;
                auVar129._24_4_ = 0x40000000;
                auVar129._28_4_ = 0x40000000;
                auVar19 = vfmadd213ps_fma(local_360,auVar129,auVar116);
                local_2c0 = _local_160;
                local_2a0 = ZEXT1632(auVar19);
                local_280 = local_180;
                local_25c = iVar14;
                local_250 = local_6c0;
                uStack_248 = uStack_6b8;
                local_240 = local_490;
                uStack_238 = uStack_488;
                local_230 = local_4a0;
                uStack_228 = uStack_498;
                local_220 = local_4b0;
                uStack_218 = uStack_4a8;
                pGVar15 = (local_7b0->scene->geometries).items[local_728].ptr;
                auVar181 = ZEXT3264(auVar72);
                local_360 = ZEXT1632(auVar19);
                auVar158 = local_360;
                if ((pGVar15->mask & local_7a8->mask) == 0) {
                  bVar75 = 0;
                  auVar117 = ZEXT3264(local_620);
                  auVar130 = ZEXT3264(local_6e0);
                }
                else {
                  auVar117 = ZEXT3264(local_620);
                  if (local_7b0->args->filter == (RTCFilterFunctionN)0x0) {
                    auVar130 = ZEXT3264(local_6e0);
                    bVar75 = 1;
                    if (pGVar15->occlusionFilterN == (RTCFilterFunctionN)0x0) goto LAB_016c7521;
                  }
                  local_680 = ZEXT1632(CONCAT88(auVar20._8_8_,pGVar15));
                  local_7a0._4_28_ = auVar125._4_28_;
                  local_7a0._0_4_ = (int)uVar79;
                  fVar119 = (float)local_260;
                  local_1e0[0] = (fVar119 + (float)local_160._0_4_ + 0.0) * local_120;
                  local_1e0[1] = (fVar119 + (float)local_160._4_4_ + 1.0) * fStack_11c;
                  local_1e0[2] = (fVar119 + fStack_158 + 2.0) * fStack_118;
                  local_1e0[3] = (fVar119 + fStack_154 + 3.0) * fStack_114;
                  fStack_1d0 = (fVar119 + fStack_150 + 4.0) * fStack_110;
                  fStack_1cc = (fVar119 + fStack_14c + 5.0) * fStack_10c;
                  fStack_1c8 = (fVar119 + fStack_148 + 6.0) * fStack_108;
                  fStack_1c4 = fVar119 + fStack_144 + 7.0;
                  local_360._0_8_ = auVar19._0_8_;
                  local_360._8_8_ = auVar19._8_8_;
                  local_1c0 = local_360._0_8_;
                  uStack_1b8 = local_360._8_8_;
                  uStack_1b0 = 0;
                  uStack_1a8 = 0;
                  local_1a0 = local_180;
                  uVar76 = vmovmskps_avx(local_200);
                  local_580 = ZEXT1632(CONCAT124(auVar23._4_12_,
                                                 (int)CONCAT71((int7)((ulong)pGVar15 >> 8),
                                                               uVar76 != 0)));
                  local_360 = auVar158;
                  if (uVar76 != 0) {
                    uVar77 = (ulong)(uVar76 & 0xff);
                    local_700 = ZEXT1632(CONCAT88(auVar89._8_8_,uVar77));
                    lVar25 = 0;
                    for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                      lVar25 = lVar25 + 1;
                    }
                    local_760._0_8_ = lVar25;
                    local_500._0_16_ = CONCAT88(uStack_488,local_490);
                    local_500 = ZEXT1632(local_500._0_16_);
                    _auStack_510 = auVar12._16_16_;
                    uStack_518 = uStack_498;
                    local_520 = (undefined1  [8])local_4a0;
                    _local_420 = ZEXT1632(CONCAT88(uStack_4a8,local_4b0));
                    do {
                      local_5b4 = local_1e0[local_760._0_8_];
                      local_5b0 = *(undefined4 *)((long)&local_1c0 + local_760._0_8_ * 4);
                      local_660._0_4_ = local_7a8->tfar;
                      local_7a8->tfar = *(float *)(local_1a0 + local_760._0_8_ * 4);
                      fVar119 = 1.0 - local_5b4;
                      auVar89 = ZEXT416((uint)local_5b4);
                      auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar89,
                                                ZEXT416(0xc0a00000));
                      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_5b4 * local_5b4 * 3.0)),
                                                ZEXT416((uint)(local_5b4 + local_5b4)),auVar23);
                      auVar23 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar89,
                                                ZEXT416(0x40000000));
                      auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar119 * fVar119 * -3.0)),
                                                ZEXT416((uint)(fVar119 + fVar119)),auVar23);
                      auVar20 = vfnmadd231ss_fma(ZEXT416((uint)(local_5b4 * (fVar119 + fVar119))),
                                                 ZEXT416((uint)fVar119),ZEXT416((uint)fVar119));
                      auVar89 = vfmadd231ss_fma(ZEXT416((uint)(local_5b4 * local_5b4)),auVar89,
                                                ZEXT416((uint)(fVar119 * -2.0)));
                      fVar119 = auVar23._0_4_ * 0.5;
                      fVar118 = auVar89._0_4_ * 0.5;
                      auVar141._0_4_ = fVar118 * (float)local_420._0_4_;
                      auVar141._4_4_ = fVar118 * (float)local_420._4_4_;
                      auVar141._8_4_ = fVar118 * (float)uStack_418;
                      auVar141._12_4_ = fVar118 * uStack_418._4_4_;
                      auVar123._4_4_ = fVar119;
                      auVar123._0_4_ = fVar119;
                      auVar123._8_4_ = fVar119;
                      auVar123._12_4_ = fVar119;
                      auVar23 = vfmadd132ps_fma(auVar123,auVar141,_local_520);
                      fVar119 = auVar19._0_4_ * 0.5;
                      auVar142._4_4_ = fVar119;
                      auVar142._0_4_ = fVar119;
                      auVar142._8_4_ = fVar119;
                      auVar142._12_4_ = fVar119;
                      auVar23 = vfmadd132ps_fma(auVar142,auVar23,local_500._0_16_);
                      fVar119 = auVar20._0_4_ * 0.5;
                      auVar124._4_4_ = fVar119;
                      auVar124._0_4_ = fVar119;
                      auVar124._8_4_ = fVar119;
                      auVar124._12_4_ = fVar119;
                      auVar71._8_8_ = uStack_6b8;
                      auVar71._0_8_ = local_6c0;
                      auVar23 = vfmadd132ps_fma(auVar124,auVar23,auVar71);
                      local_6b0.context = local_7b0->user;
                      local_5c0 = vmovlps_avx(auVar23);
                      local_5b8 = vextractps_avx(auVar23,2);
                      local_5ac = (int)local_588;
                      local_5a8 = (int)local_728;
                      local_5a4 = (local_6b0.context)->instID[0];
                      local_5a0 = (local_6b0.context)->instPrimID[0];
                      local_7b4 = -1;
                      local_6b0.valid = &local_7b4;
                      local_6b0.geometryUserPtr = *(void **)(local_680._0_8_ + 0x18);
                      local_6b0.ray = (RTCRayN *)local_7a8;
                      local_6b0.hit = (RTCHitN *)&local_5c0;
                      local_6b0.N = 1;
                      if (*(code **)(local_680._0_8_ + 0x48) == (code *)0x0) {
LAB_016c7421:
                        p_Var17 = local_7b0->args->filter;
                        if (p_Var17 == (RTCFilterFunctionN)0x0) break;
                        if (((local_7b0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_680._0_8_ + 0x3e) & 0x40) != 0)) {
                          auVar201 = ZEXT1664(auVar201._0_16_);
                          (*p_Var17)(&local_6b0);
                        }
                        if (*local_6b0.valid != 0) break;
                      }
                      else {
                        auVar201 = ZEXT1664(auVar201._0_16_);
                        (**(code **)(local_680._0_8_ + 0x48))(&local_6b0);
                        if (*local_6b0.valid != 0) goto LAB_016c7421;
                      }
                      local_7a8->tfar = (float)local_660._0_4_;
                      uVar79 = local_700._0_8_ ^ 1L << (local_760._0_8_ & 0x3f);
                      local_700._0_8_ = uVar79;
                      lVar25 = 0;
                      for (uVar77 = uVar79; (uVar77 & 1) == 0;
                          uVar77 = uVar77 >> 1 | 0x8000000000000000) {
                        lVar25 = lVar25 + 1;
                      }
                      local_760._0_8_ = lVar25;
                      local_580._0_4_ = (int)CONCAT71((int7)((ulong)lVar25 >> 8),uVar79 != 0);
                    } while (uVar79 != 0);
                  }
                  bVar75 = local_580[0] & 1;
                  auVar130 = ZEXT3264(local_6e0);
                  auVar117 = ZEXT3264(local_620);
                  auVar174 = ZEXT3264(local_5e0);
                  auVar162 = ZEXT3264(CONCAT428(fStack_524,
                                                CONCAT424(fStack_528,
                                                          CONCAT420(fStack_52c,
                                                                    CONCAT416(fStack_530,
                                                                              CONCAT412(fStack_534,
                                                                                        CONCAT48(
                                                  fStack_538,CONCAT44(fStack_53c,local_540))))))));
                  auVar181 = ZEXT3264(CONCAT428(fStack_4c4,
                                                CONCAT424(fStack_4c8,
                                                          CONCAT420(fStack_4cc,
                                                                    CONCAT416(fStack_4d0,
                                                                              CONCAT412(fStack_4d4,
                                                                                        CONCAT48(
                                                  fStack_4d8,CONCAT44(fStack_4dc,local_4e0))))))));
                  auVar168 = ZEXT3264(local_560);
                  auVar213 = ZEXT3264(local_720);
                  uVar79 = (ulong)(uint)local_7a0._0_4_;
                }
LAB_016c7521:
                uVar79 = CONCAT71((int7)(uVar79 >> 8),(byte)uVar79 | bVar75);
                auVar135 = ZEXT3264(local_600);
              }
            }
          }
          lVar81 = lVar81 + 8;
        } while ((int)lVar81 < iVar14);
      }
      if ((uVar79 & 1) != 0) {
        return local_7b5;
      }
      fVar119 = local_7a8->tfar;
      auVar88._4_4_ = fVar119;
      auVar88._0_4_ = fVar119;
      auVar88._8_4_ = fVar119;
      auVar88._12_4_ = fVar119;
      auVar23 = vcmpps_avx(local_2e0,auVar88,2);
      uVar76 = vmovmskps_avx(auVar23);
      uVar76 = (uint)uVar80 & uVar76;
      local_7b5 = uVar76 != 0;
      ray = local_7a8;
      context = local_7b0;
      pre = local_768;
    } while (local_7b5);
  }
  return local_7b5;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }